

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_h<embree::sse2::RibbonCurve1Intersector1<embree::HermiteCurveT,4>,embree::sse2::Intersect1EpilogMU<4,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [12];
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Primitive PVar18;
  int iVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  long lVar22;
  RTCFilterFunctionN p_Var23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined6 uVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  bool bVar51;
  int iVar52;
  undefined4 uVar53;
  ulong uVar54;
  long lVar55;
  RayHit *pRVar56;
  ulong uVar57;
  int iVar58;
  ulong uVar59;
  RTCIntersectArguments *pRVar60;
  ulong uVar61;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  undefined8 uVar62;
  long lVar63;
  long lVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  short sVar71;
  float fVar72;
  float fVar108;
  float fVar109;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar110;
  float fVar111;
  float fVar139;
  float fVar141;
  undefined1 auVar112 [16];
  undefined1 auVar115 [16];
  undefined1 auVar118 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar140;
  float fVar142;
  float fVar143;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar144;
  float fVar154;
  float fVar155;
  vfloat4 v;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar156;
  float fVar172;
  float fVar173;
  vfloat4 v_1;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar174;
  float fVar180;
  float fVar181;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar182;
  float fVar203;
  float fVar204;
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar205;
  float fVar209;
  float fVar210;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar211;
  float fVar219;
  float fVar220;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar229;
  undefined4 uVar230;
  float fVar231;
  undefined1 auVar225 [16];
  undefined1 auVar228 [16];
  float fVar232;
  float fVar237;
  float fVar238;
  undefined1 auVar233 [16];
  undefined1 auVar236 [16];
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar249;
  float fVar252;
  float fVar255;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar250;
  float fVar251;
  float fVar253;
  float fVar254;
  float fVar256;
  float fVar257;
  undefined1 auVar248 [16];
  float fVar258;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar272;
  float fVar273;
  float fVar278;
  float fVar280;
  float fVar282;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar279;
  float fVar281;
  float fVar283;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar284;
  float fVar285;
  undefined4 uVar288;
  float fVar289;
  float fVar291;
  float fVar293;
  undefined1 auVar286 [16];
  float fVar290;
  float fVar292;
  float fVar294;
  undefined1 auVar287 [16];
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_4> bhit;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_43c [8];
  float fStack_434;
  undefined4 uStack_430;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aStack_42c;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  anon_union_12_2_4062524c_for_Vec3<float>_1 aStack_40c;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  uint auStack_3f0 [1];
  uint auStack_3ec [1];
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  RTCIntersectArguments *local_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  ulong local_3a0;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  Primitive *local_2f8;
  Precalculations *local_2f0;
  RTCFilterFunctionNArguments local_2e8;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined8 local_208;
  float local_200;
  float local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  uint local_1ec;
  uint local_1e8;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  uint local_128;
  int local_124;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  float local_c8 [4];
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8 [4];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 uVar106;
  undefined2 uVar107;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  
  PVar18 = prim[1];
  uVar54 = (ulong)(byte)PVar18;
  lVar24 = uVar54 * 0x25;
  pPVar7 = prim + lVar24 + 6;
  fVar155 = *(float *)(pPVar7 + 0xc);
  fVar156 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar7) * fVar155;
  fVar172 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar7 + 4)) * fVar155;
  fVar173 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar7 + 8)) * fVar155;
  fVar144 = fVar155 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar154 = fVar155 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar155 = fVar155 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar288 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar106 = (undefined1)((uint)uVar288 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar288 >> 0x10);
  uVar62 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar288));
  uVar106 = (undefined1)((uint)uVar288 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar62 >> 0x20),uVar106),uVar106);
  sVar71 = CONCAT11((char)uVar288,(char)uVar288);
  uVar57 = CONCAT62(uVar29,sVar71);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar57;
  auVar73._12_2_ = uVar107;
  auVar73._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar62 >> 0x20);
  auVar146._12_4_ = auVar73._12_4_;
  auVar146._8_2_ = 0;
  auVar146._0_8_ = uVar57;
  auVar146._10_2_ = uVar107;
  auVar74._10_6_ = auVar146._10_6_;
  auVar74._8_2_ = uVar107;
  auVar74._0_8_ = uVar57;
  uVar107 = (undefined2)uVar29;
  auVar30._4_8_ = auVar74._8_8_;
  auVar30._2_2_ = uVar107;
  auVar30._0_2_ = uVar107;
  fVar272 = (float)((int)sVar71 >> 8);
  fVar278 = (float)(auVar30._0_4_ >> 0x18);
  fVar280 = (float)(auVar74._8_4_ >> 0x18);
  uVar288 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar106 = (undefined1)((uint)uVar288 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar288 >> 0x10);
  uVar62 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar288));
  uVar106 = (undefined1)((uint)uVar288 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar62 >> 0x20),uVar106),uVar106);
  sVar71 = CONCAT11((char)uVar288,(char)uVar288);
  uVar57 = CONCAT62(uVar29,sVar71);
  auVar114._8_4_ = 0;
  auVar114._0_8_ = uVar57;
  auVar114._12_2_ = uVar107;
  auVar114._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar62 >> 0x20);
  auVar113._12_4_ = auVar114._12_4_;
  auVar113._8_2_ = 0;
  auVar113._0_8_ = uVar57;
  auVar113._10_2_ = uVar107;
  auVar112._10_6_ = auVar113._10_6_;
  auVar112._8_2_ = uVar107;
  auVar112._0_8_ = uVar57;
  uVar107 = (undefined2)uVar29;
  auVar31._4_8_ = auVar112._8_8_;
  auVar31._2_2_ = uVar107;
  auVar31._0_2_ = uVar107;
  fVar174 = (float)((int)sVar71 >> 8);
  fVar180 = (float)(auVar31._0_4_ >> 0x18);
  fVar181 = (float)(auVar112._8_4_ >> 0x18);
  uVar288 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar106 = (undefined1)((uint)uVar288 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar288 >> 0x10);
  uVar62 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar288));
  uVar106 = (undefined1)((uint)uVar288 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar62 >> 0x20),uVar106),uVar106);
  sVar71 = CONCAT11((char)uVar288,(char)uVar288);
  uVar57 = CONCAT62(uVar29,sVar71);
  auVar117._8_4_ = 0;
  auVar117._0_8_ = uVar57;
  auVar117._12_2_ = uVar107;
  auVar117._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar62 >> 0x20);
  auVar116._12_4_ = auVar117._12_4_;
  auVar116._8_2_ = 0;
  auVar116._0_8_ = uVar57;
  auVar116._10_2_ = uVar107;
  auVar115._10_6_ = auVar116._10_6_;
  auVar115._8_2_ = uVar107;
  auVar115._0_8_ = uVar57;
  uVar107 = (undefined2)uVar29;
  auVar32._4_8_ = auVar115._8_8_;
  auVar32._2_2_ = uVar107;
  auVar32._0_2_ = uVar107;
  fVar205 = (float)((int)sVar71 >> 8);
  fVar209 = (float)(auVar32._0_4_ >> 0x18);
  fVar210 = (float)(auVar115._8_4_ >> 0x18);
  uVar288 = *(undefined4 *)(prim + uVar54 * 0xf + 6);
  uVar106 = (undefined1)((uint)uVar288 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar288 >> 0x10);
  uVar62 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar288));
  uVar106 = (undefined1)((uint)uVar288 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar62 >> 0x20),uVar106),uVar106);
  sVar71 = CONCAT11((char)uVar288,(char)uVar288);
  uVar57 = CONCAT62(uVar29,sVar71);
  auVar120._8_4_ = 0;
  auVar120._0_8_ = uVar57;
  auVar120._12_2_ = uVar107;
  auVar120._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar62 >> 0x20);
  auVar119._12_4_ = auVar120._12_4_;
  auVar119._8_2_ = 0;
  auVar119._0_8_ = uVar57;
  auVar119._10_2_ = uVar107;
  auVar118._10_6_ = auVar119._10_6_;
  auVar118._8_2_ = uVar107;
  auVar118._0_8_ = uVar57;
  uVar107 = (undefined2)uVar29;
  auVar33._4_8_ = auVar118._8_8_;
  auVar33._2_2_ = uVar107;
  auVar33._0_2_ = uVar107;
  fVar72 = (float)((int)sVar71 >> 8);
  fVar108 = (float)(auVar33._0_4_ >> 0x18);
  fVar109 = (float)(auVar118._8_4_ >> 0x18);
  uVar288 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + 6);
  uVar106 = (undefined1)((uint)uVar288 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar288 >> 0x10);
  uVar62 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar288));
  uVar106 = (undefined1)((uint)uVar288 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar62 >> 0x20),uVar106),uVar106);
  sVar71 = CONCAT11((char)uVar288,(char)uVar288);
  uVar57 = CONCAT62(uVar29,sVar71);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar57;
  auVar185._12_2_ = uVar107;
  auVar185._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar62 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar57;
  auVar184._10_2_ = uVar107;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar107;
  auVar183._0_8_ = uVar57;
  uVar107 = (undefined2)uVar29;
  auVar34._4_8_ = auVar183._8_8_;
  auVar34._2_2_ = uVar107;
  auVar34._0_2_ = uVar107;
  fVar211 = (float)((int)sVar71 >> 8);
  fVar219 = (float)(auVar34._0_4_ >> 0x18);
  fVar220 = (float)(auVar183._8_4_ >> 0x18);
  uVar288 = *(undefined4 *)(prim + (ulong)(byte)PVar18 * 0x10 + uVar54 + 6);
  uVar106 = (undefined1)((uint)uVar288 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar288 >> 0x10);
  uVar62 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar288));
  uVar106 = (undefined1)((uint)uVar288 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar62 >> 0x20),uVar106),uVar106);
  sVar71 = CONCAT11((char)uVar288,(char)uVar288);
  uVar57 = CONCAT62(uVar29,sVar71);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar57;
  auVar188._12_2_ = uVar107;
  auVar188._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar62 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar57;
  auVar187._10_2_ = uVar107;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar107;
  auVar186._0_8_ = uVar57;
  uVar107 = (undefined2)uVar29;
  auVar35._4_8_ = auVar186._8_8_;
  auVar35._2_2_ = uVar107;
  auVar35._0_2_ = uVar107;
  fVar224 = (float)((int)sVar71 >> 8);
  fVar229 = (float)(auVar35._0_4_ >> 0x18);
  fVar231 = (float)(auVar186._8_4_ >> 0x18);
  uVar288 = *(undefined4 *)(prim + uVar54 * 0x1a + 6);
  uVar106 = (undefined1)((uint)uVar288 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar288 >> 0x10);
  uVar62 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar288));
  uVar106 = (undefined1)((uint)uVar288 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar62 >> 0x20),uVar106),uVar106);
  sVar71 = CONCAT11((char)uVar288,(char)uVar288);
  uVar57 = CONCAT62(uVar29,sVar71);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar57;
  auVar191._12_2_ = uVar107;
  auVar191._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar62 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar57;
  auVar190._10_2_ = uVar107;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar107;
  auVar189._0_8_ = uVar57;
  uVar107 = (undefined2)uVar29;
  auVar36._4_8_ = auVar189._8_8_;
  auVar36._2_2_ = uVar107;
  auVar36._0_2_ = uVar107;
  fVar221 = (float)((int)sVar71 >> 8);
  fVar222 = (float)(auVar36._0_4_ >> 0x18);
  fVar223 = (float)(auVar189._8_4_ >> 0x18);
  uVar288 = *(undefined4 *)(prim + uVar54 * 0x1b + 6);
  uVar106 = (undefined1)((uint)uVar288 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar288 >> 0x10);
  uVar62 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar288));
  uVar106 = (undefined1)((uint)uVar288 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar62 >> 0x20),uVar106),uVar106);
  sVar71 = CONCAT11((char)uVar288,(char)uVar288);
  uVar57 = CONCAT62(uVar29,sVar71);
  auVar194._8_4_ = 0;
  auVar194._0_8_ = uVar57;
  auVar194._12_2_ = uVar107;
  auVar194._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar62 >> 0x20);
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = uVar57;
  auVar193._10_2_ = uVar107;
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = uVar107;
  auVar192._0_8_ = uVar57;
  uVar107 = (undefined2)uVar29;
  auVar37._4_8_ = auVar192._8_8_;
  auVar37._2_2_ = uVar107;
  auVar37._0_2_ = uVar107;
  fVar232 = (float)((int)sVar71 >> 8);
  fVar237 = (float)(auVar37._0_4_ >> 0x18);
  fVar238 = (float)(auVar192._8_4_ >> 0x18);
  uVar288 = *(undefined4 *)(prim + uVar54 * 0x1c + 6);
  uVar106 = (undefined1)((uint)uVar288 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar288 >> 0x10);
  uVar62 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar288));
  uVar106 = (undefined1)((uint)uVar288 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar62 >> 0x20),uVar106),uVar106);
  sVar71 = CONCAT11((char)uVar288,(char)uVar288);
  uVar57 = CONCAT62(uVar29,sVar71);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar57;
  auVar197._12_2_ = uVar107;
  auVar197._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar62 >> 0x20);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar57;
  auVar196._10_2_ = uVar107;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar107;
  auVar195._0_8_ = uVar57;
  uVar107 = (undefined2)uVar29;
  auVar38._4_8_ = auVar195._8_8_;
  auVar38._2_2_ = uVar107;
  auVar38._0_2_ = uVar107;
  fVar110 = (float)((int)sVar71 >> 8);
  fVar139 = (float)(auVar38._0_4_ >> 0x18);
  fVar141 = (float)(auVar195._8_4_ >> 0x18);
  fVar258 = fVar144 * fVar272 + fVar154 * fVar174 + fVar155 * fVar205;
  fVar269 = fVar144 * fVar278 + fVar154 * fVar180 + fVar155 * fVar209;
  fVar270 = fVar144 * fVar280 + fVar154 * fVar181 + fVar155 * fVar210;
  fVar271 = fVar144 * (float)(auVar146._12_4_ >> 0x18) +
            fVar154 * (float)(auVar113._12_4_ >> 0x18) + fVar155 * (float)(auVar116._12_4_ >> 0x18);
  fVar239 = fVar144 * fVar72 + fVar154 * fVar211 + fVar155 * fVar224;
  fVar249 = fVar144 * fVar108 + fVar154 * fVar219 + fVar155 * fVar229;
  fVar252 = fVar144 * fVar109 + fVar154 * fVar220 + fVar155 * fVar231;
  fVar255 = fVar144 * (float)(auVar119._12_4_ >> 0x18) +
            fVar154 * (float)(auVar184._12_4_ >> 0x18) + fVar155 * (float)(auVar187._12_4_ >> 0x18);
  fVar182 = fVar144 * fVar221 + fVar154 * fVar232 + fVar155 * fVar110;
  fVar203 = fVar144 * fVar222 + fVar154 * fVar237 + fVar155 * fVar139;
  fVar204 = fVar144 * fVar223 + fVar154 * fVar238 + fVar155 * fVar141;
  fVar144 = fVar144 * (float)(auVar190._12_4_ >> 0x18) +
            fVar154 * (float)(auVar193._12_4_ >> 0x18) + fVar155 * (float)(auVar196._12_4_ >> 0x18);
  fVar273 = fVar272 * fVar156 + fVar174 * fVar172 + fVar205 * fVar173;
  fVar278 = fVar278 * fVar156 + fVar180 * fVar172 + fVar209 * fVar173;
  fVar280 = fVar280 * fVar156 + fVar181 * fVar172 + fVar210 * fVar173;
  fVar282 = (float)(auVar146._12_4_ >> 0x18) * fVar156 +
            (float)(auVar113._12_4_ >> 0x18) * fVar172 + (float)(auVar116._12_4_ >> 0x18) * fVar173;
  fVar224 = fVar72 * fVar156 + fVar211 * fVar172 + fVar224 * fVar173;
  fVar229 = fVar108 * fVar156 + fVar219 * fVar172 + fVar229 * fVar173;
  fVar231 = fVar109 * fVar156 + fVar220 * fVar172 + fVar231 * fVar173;
  fVar272 = (float)(auVar119._12_4_ >> 0x18) * fVar156 +
            (float)(auVar184._12_4_ >> 0x18) * fVar172 + (float)(auVar187._12_4_ >> 0x18) * fVar173;
  fVar221 = fVar156 * fVar221 + fVar172 * fVar232 + fVar173 * fVar110;
  fVar222 = fVar156 * fVar222 + fVar172 * fVar237 + fVar173 * fVar139;
  fVar223 = fVar156 * fVar223 + fVar172 * fVar238 + fVar173 * fVar141;
  fVar232 = fVar156 * (float)(auVar190._12_4_ >> 0x18) +
            fVar172 * (float)(auVar193._12_4_ >> 0x18) + fVar173 * (float)(auVar196._12_4_ >> 0x18);
  fVar155 = (float)DAT_01f80d30;
  fVar72 = DAT_01f80d30._4_4_;
  fVar108 = DAT_01f80d30._8_4_;
  fVar109 = DAT_01f80d30._12_4_;
  uVar65 = -(uint)(fVar155 <= ABS(fVar258));
  uVar66 = -(uint)(fVar72 <= ABS(fVar269));
  uVar67 = -(uint)(fVar108 <= ABS(fVar270));
  uVar68 = -(uint)(fVar109 <= ABS(fVar271));
  auVar259._0_4_ = (uint)fVar258 & uVar65;
  auVar259._4_4_ = (uint)fVar269 & uVar66;
  auVar259._8_4_ = (uint)fVar270 & uVar67;
  auVar259._12_4_ = (uint)fVar271 & uVar68;
  auVar157._0_4_ = ~uVar65 & (uint)fVar155;
  auVar157._4_4_ = ~uVar66 & (uint)fVar72;
  auVar157._8_4_ = ~uVar67 & (uint)fVar108;
  auVar157._12_4_ = ~uVar68 & (uint)fVar109;
  auVar157 = auVar157 | auVar259;
  uVar65 = -(uint)(fVar155 <= ABS(fVar239));
  uVar66 = -(uint)(fVar72 <= ABS(fVar249));
  uVar67 = -(uint)(fVar108 <= ABS(fVar252));
  uVar68 = -(uint)(fVar109 <= ABS(fVar255));
  auVar242._0_4_ = (uint)fVar239 & uVar65;
  auVar242._4_4_ = (uint)fVar249 & uVar66;
  auVar242._8_4_ = (uint)fVar252 & uVar67;
  auVar242._12_4_ = (uint)fVar255 & uVar68;
  auVar206._0_4_ = ~uVar65 & (uint)fVar155;
  auVar206._4_4_ = ~uVar66 & (uint)fVar72;
  auVar206._8_4_ = ~uVar67 & (uint)fVar108;
  auVar206._12_4_ = ~uVar68 & (uint)fVar109;
  auVar206 = auVar206 | auVar242;
  uVar65 = -(uint)(fVar155 <= ABS(fVar182));
  uVar66 = -(uint)(fVar72 <= ABS(fVar203));
  uVar67 = -(uint)(fVar108 <= ABS(fVar204));
  uVar68 = -(uint)(fVar109 <= ABS(fVar144));
  auVar198._0_4_ = (uint)fVar182 & uVar65;
  auVar198._4_4_ = (uint)fVar203 & uVar66;
  auVar198._8_4_ = (uint)fVar204 & uVar67;
  auVar198._12_4_ = (uint)fVar144 & uVar68;
  auVar212._0_4_ = ~uVar65 & (uint)fVar155;
  auVar212._4_4_ = ~uVar66 & (uint)fVar72;
  auVar212._8_4_ = ~uVar67 & (uint)fVar108;
  auVar212._12_4_ = ~uVar68 & (uint)fVar109;
  auVar212 = auVar212 | auVar198;
  auVar74 = rcpps(_DAT_01f80d30,auVar157);
  fVar155 = auVar74._0_4_;
  fVar109 = auVar74._4_4_;
  fVar174 = auVar74._8_4_;
  fVar211 = auVar74._12_4_;
  fVar155 = (1.0 - auVar157._0_4_ * fVar155) * fVar155 + fVar155;
  fVar109 = (1.0 - auVar157._4_4_ * fVar109) * fVar109 + fVar109;
  fVar174 = (1.0 - auVar157._8_4_ * fVar174) * fVar174 + fVar174;
  fVar211 = (1.0 - auVar157._12_4_ * fVar211) * fVar211 + fVar211;
  auVar74 = rcpps(auVar74,auVar206);
  fVar72 = auVar74._0_4_;
  fVar110 = auVar74._4_4_;
  fVar180 = auVar74._8_4_;
  fVar219 = auVar74._12_4_;
  fVar72 = (1.0 - auVar206._0_4_ * fVar72) * fVar72 + fVar72;
  fVar110 = (1.0 - auVar206._4_4_ * fVar110) * fVar110 + fVar110;
  fVar180 = (1.0 - auVar206._8_4_ * fVar180) * fVar180 + fVar180;
  fVar219 = (1.0 - auVar206._12_4_ * fVar219) * fVar219 + fVar219;
  auVar74 = rcpps(auVar74,auVar212);
  fVar108 = auVar74._0_4_;
  fVar139 = auVar74._4_4_;
  fVar181 = auVar74._8_4_;
  fVar220 = auVar74._12_4_;
  fVar108 = (1.0 - auVar212._0_4_ * fVar108) * fVar108 + fVar108;
  fVar139 = (1.0 - auVar212._4_4_ * fVar139) * fVar139 + fVar139;
  fVar181 = (1.0 - auVar212._8_4_ * fVar181) * fVar181 + fVar181;
  fVar220 = (1.0 - auVar212._12_4_ * fVar220) * fVar220 + fVar220;
  fVar237 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar24 + 0x16)) *
            *(float *)(prim + lVar24 + 0x1a);
  uVar57 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar107 = (undefined2)(uVar57 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar57;
  auVar77._12_2_ = uVar107;
  auVar77._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar57 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar57;
  auVar76._10_2_ = uVar107;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar107;
  auVar75._0_8_ = uVar57;
  uVar107 = (undefined2)(uVar57 >> 0x10);
  auVar39._4_8_ = auVar75._8_8_;
  auVar39._2_2_ = uVar107;
  auVar39._0_2_ = uVar107;
  fVar141 = (float)(auVar39._0_4_ >> 0x10);
  fVar182 = (float)(auVar75._8_4_ >> 0x10);
  uVar61 = *(ulong *)(prim + uVar54 * 0xb + 6);
  uVar107 = (undefined2)(uVar61 >> 0x30);
  auVar160._8_4_ = 0;
  auVar160._0_8_ = uVar61;
  auVar160._12_2_ = uVar107;
  auVar160._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar61 >> 0x20);
  auVar159._12_4_ = auVar160._12_4_;
  auVar159._8_2_ = 0;
  auVar159._0_8_ = uVar61;
  auVar159._10_2_ = uVar107;
  auVar158._10_6_ = auVar159._10_6_;
  auVar158._8_2_ = uVar107;
  auVar158._0_8_ = uVar61;
  uVar107 = (undefined2)(uVar61 >> 0x10);
  auVar40._4_8_ = auVar158._8_8_;
  auVar40._2_2_ = uVar107;
  auVar40._0_2_ = uVar107;
  uVar10 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar107 = (undefined2)(uVar10 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar10;
  auVar80._12_2_ = uVar107;
  auVar80._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar10 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar10;
  auVar79._10_2_ = uVar107;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar107;
  auVar78._0_8_ = uVar10;
  uVar107 = (undefined2)(uVar10 >> 0x10);
  auVar41._4_8_ = auVar78._8_8_;
  auVar41._2_2_ = uVar107;
  auVar41._0_2_ = uVar107;
  fVar144 = (float)(auVar41._0_4_ >> 0x10);
  fVar203 = (float)(auVar78._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar54 * 0xd + 6);
  uVar107 = (undefined2)(uVar11 >> 0x30);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar11;
  auVar215._12_2_ = uVar107;
  auVar215._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar11 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar11;
  auVar214._10_2_ = uVar107;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar107;
  auVar213._0_8_ = uVar11;
  uVar107 = (undefined2)(uVar11 >> 0x10);
  auVar42._4_8_ = auVar213._8_8_;
  auVar42._2_2_ = uVar107;
  auVar42._0_2_ = uVar107;
  uVar12 = *(ulong *)(prim + uVar54 * 0x12 + 6);
  uVar107 = (undefined2)(uVar12 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar12;
  auVar83._12_2_ = uVar107;
  auVar83._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar12 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar12;
  auVar82._10_2_ = uVar107;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar107;
  auVar81._0_8_ = uVar12;
  uVar107 = (undefined2)(uVar12 >> 0x10);
  auVar43._4_8_ = auVar81._8_8_;
  auVar43._2_2_ = uVar107;
  auVar43._0_2_ = uVar107;
  fVar154 = (float)(auVar43._0_4_ >> 0x10);
  fVar204 = (float)(auVar81._8_4_ >> 0x10);
  uVar59 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar13 = *(ulong *)(prim + uVar54 * 2 + uVar59 + 6);
  uVar107 = (undefined2)(uVar13 >> 0x30);
  auVar227._8_4_ = 0;
  auVar227._0_8_ = uVar13;
  auVar227._12_2_ = uVar107;
  auVar227._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar13 >> 0x20);
  auVar226._12_4_ = auVar227._12_4_;
  auVar226._8_2_ = 0;
  auVar226._0_8_ = uVar13;
  auVar226._10_2_ = uVar107;
  auVar225._10_6_ = auVar226._10_6_;
  auVar225._8_2_ = uVar107;
  auVar225._0_8_ = uVar13;
  uVar107 = (undefined2)(uVar13 >> 0x10);
  auVar44._4_8_ = auVar225._8_8_;
  auVar44._2_2_ = uVar107;
  auVar44._0_2_ = uVar107;
  uVar59 = *(ulong *)(prim + uVar59 + 6);
  uVar107 = (undefined2)(uVar59 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar59;
  auVar86._12_2_ = uVar107;
  auVar86._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar59 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar59;
  auVar85._10_2_ = uVar107;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar107;
  auVar84._0_8_ = uVar59;
  uVar107 = (undefined2)(uVar59 >> 0x10);
  auVar45._4_8_ = auVar84._8_8_;
  auVar45._2_2_ = uVar107;
  auVar45._0_2_ = uVar107;
  fVar156 = (float)(auVar45._0_4_ >> 0x10);
  fVar205 = (float)(auVar84._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar54 * 0x18 + 6);
  uVar107 = (undefined2)(uVar14 >> 0x30);
  auVar235._8_4_ = 0;
  auVar235._0_8_ = uVar14;
  auVar235._12_2_ = uVar107;
  auVar235._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar14 >> 0x20);
  auVar234._12_4_ = auVar235._12_4_;
  auVar234._8_2_ = 0;
  auVar234._0_8_ = uVar14;
  auVar234._10_2_ = uVar107;
  auVar233._10_6_ = auVar234._10_6_;
  auVar233._8_2_ = uVar107;
  auVar233._0_8_ = uVar14;
  uVar107 = (undefined2)(uVar14 >> 0x10);
  auVar46._4_8_ = auVar233._8_8_;
  auVar46._2_2_ = uVar107;
  auVar46._0_2_ = uVar107;
  uVar15 = *(ulong *)(prim + uVar54 * 0x1d + 6);
  uVar107 = (undefined2)(uVar15 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar15;
  auVar89._12_2_ = uVar107;
  auVar89._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar15 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar15;
  auVar88._10_2_ = uVar107;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar107;
  auVar87._0_8_ = uVar15;
  uVar107 = (undefined2)(uVar15 >> 0x10);
  auVar47._4_8_ = auVar87._8_8_;
  auVar47._2_2_ = uVar107;
  auVar47._0_2_ = uVar107;
  fVar172 = (float)(auVar47._0_4_ >> 0x10);
  fVar209 = (float)(auVar87._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar54 + (ulong)(byte)PVar18 * 0x20 + 6);
  uVar107 = (undefined2)(uVar16 >> 0x30);
  auVar245._8_4_ = 0;
  auVar245._0_8_ = uVar16;
  auVar245._12_2_ = uVar107;
  auVar245._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar16 >> 0x20);
  auVar244._12_4_ = auVar245._12_4_;
  auVar244._8_2_ = 0;
  auVar244._0_8_ = uVar16;
  auVar244._10_2_ = uVar107;
  auVar243._10_6_ = auVar244._10_6_;
  auVar243._8_2_ = uVar107;
  auVar243._0_8_ = uVar16;
  uVar107 = (undefined2)(uVar16 >> 0x10);
  auVar48._4_8_ = auVar243._8_8_;
  auVar48._2_2_ = uVar107;
  auVar48._0_2_ = uVar107;
  uVar17 = *(ulong *)(prim + ((ulong)(byte)PVar18 * 0x20 - uVar54) + 6);
  uVar107 = (undefined2)(uVar17 >> 0x30);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar17;
  auVar92._12_2_ = uVar107;
  auVar92._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar17 >> 0x20);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_2_ = 0;
  auVar91._0_8_ = uVar17;
  auVar91._10_2_ = uVar107;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._8_2_ = uVar107;
  auVar90._0_8_ = uVar17;
  uVar107 = (undefined2)(uVar17 >> 0x10);
  auVar49._4_8_ = auVar90._8_8_;
  auVar49._2_2_ = uVar107;
  auVar49._0_2_ = uVar107;
  fVar173 = (float)(auVar49._0_4_ >> 0x10);
  fVar210 = (float)(auVar90._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar54 * 0x23 + 6);
  uVar107 = (undefined2)(uVar54 >> 0x30);
  auVar262._8_4_ = 0;
  auVar262._0_8_ = uVar54;
  auVar262._12_2_ = uVar107;
  auVar262._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar54 >> 0x20);
  auVar261._12_4_ = auVar262._12_4_;
  auVar261._8_2_ = 0;
  auVar261._0_8_ = uVar54;
  auVar261._10_2_ = uVar107;
  auVar260._10_6_ = auVar261._10_6_;
  auVar260._8_2_ = uVar107;
  auVar260._0_8_ = uVar54;
  uVar107 = (undefined2)(uVar54 >> 0x10);
  auVar50._4_8_ = auVar260._8_8_;
  auVar50._2_2_ = uVar107;
  auVar50._0_2_ = uVar107;
  auVar161._0_8_ =
       CONCAT44(((((float)(auVar40._0_4_ >> 0x10) - fVar141) * fVar237 + fVar141) - fVar278) *
                fVar109,((((float)(int)(short)uVar61 - (float)(int)(short)uVar57) * fVar237 +
                         (float)(int)(short)uVar57) - fVar273) * fVar155);
  auVar161._8_4_ =
       ((((float)(auVar158._8_4_ >> 0x10) - fVar182) * fVar237 + fVar182) - fVar280) * fVar174;
  auVar161._12_4_ =
       ((((float)(auVar159._12_4_ >> 0x10) - (float)(auVar76._12_4_ >> 0x10)) * fVar237 +
        (float)(auVar76._12_4_ >> 0x10)) - fVar282) * fVar211;
  auVar216._0_4_ =
       ((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar237 +
        (float)(int)(short)uVar10) - fVar273) * fVar155;
  auVar216._4_4_ =
       ((((float)(auVar42._0_4_ >> 0x10) - fVar144) * fVar237 + fVar144) - fVar278) * fVar109;
  auVar216._8_4_ =
       ((((float)(auVar213._8_4_ >> 0x10) - fVar203) * fVar237 + fVar203) - fVar280) * fVar174;
  auVar216._12_4_ =
       ((((float)(auVar214._12_4_ >> 0x10) - (float)(auVar79._12_4_ >> 0x10)) * fVar237 +
        (float)(auVar79._12_4_ >> 0x10)) - fVar282) * fVar211;
  auVar228._0_8_ =
       CONCAT44(((((float)(auVar44._0_4_ >> 0x10) - fVar154) * fVar237 + fVar154) - fVar229) *
                fVar110,((((float)(int)(short)uVar13 - (float)(int)(short)uVar12) * fVar237 +
                         (float)(int)(short)uVar12) - fVar224) * fVar72);
  auVar228._8_4_ =
       ((((float)(auVar225._8_4_ >> 0x10) - fVar204) * fVar237 + fVar204) - fVar231) * fVar180;
  auVar228._12_4_ =
       ((((float)(auVar226._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar237 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar272) * fVar219;
  auVar236._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar59) * fVar237 +
        (float)(int)(short)uVar59) - fVar224) * fVar72;
  auVar236._4_4_ =
       ((((float)(auVar46._0_4_ >> 0x10) - fVar156) * fVar237 + fVar156) - fVar229) * fVar110;
  auVar236._8_4_ =
       ((((float)(auVar233._8_4_ >> 0x10) - fVar205) * fVar237 + fVar205) - fVar231) * fVar180;
  auVar236._12_4_ =
       ((((float)(auVar234._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar237 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar272) * fVar219;
  auVar246._0_8_ =
       CONCAT44(((((float)(auVar48._0_4_ >> 0x10) - fVar172) * fVar237 + fVar172) - fVar222) *
                fVar139,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar237 +
                         (float)(int)(short)uVar15) - fVar221) * fVar108);
  auVar246._8_4_ =
       ((((float)(auVar243._8_4_ >> 0x10) - fVar209) * fVar237 + fVar209) - fVar223) * fVar181;
  auVar246._12_4_ =
       ((((float)(auVar244._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar237 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar232) * fVar220;
  auVar263._0_4_ =
       ((((float)(int)(short)uVar54 - (float)(int)(short)uVar17) * fVar237 +
        (float)(int)(short)uVar17) - fVar221) * fVar108;
  auVar263._4_4_ =
       ((((float)(auVar50._0_4_ >> 0x10) - fVar173) * fVar237 + fVar173) - fVar222) * fVar139;
  auVar263._8_4_ =
       ((((float)(auVar260._8_4_ >> 0x10) - fVar210) * fVar237 + fVar210) - fVar223) * fVar181;
  auVar263._12_4_ =
       ((((float)(auVar261._12_4_ >> 0x10) - (float)(auVar91._12_4_ >> 0x10)) * fVar237 +
        (float)(auVar91._12_4_ >> 0x10)) - fVar232) * fVar220;
  auVar145._8_4_ = auVar161._8_4_;
  auVar145._0_8_ = auVar161._0_8_;
  auVar145._12_4_ = auVar161._12_4_;
  auVar146 = minps(auVar145,auVar216);
  auVar93._8_4_ = auVar228._8_4_;
  auVar93._0_8_ = auVar228._0_8_;
  auVar93._12_4_ = auVar228._12_4_;
  auVar74 = minps(auVar93,auVar236);
  auVar146 = maxps(auVar146,auVar74);
  auVar94._8_4_ = auVar246._8_4_;
  auVar94._0_8_ = auVar246._0_8_;
  auVar94._12_4_ = auVar246._12_4_;
  auVar74 = minps(auVar94,auVar263);
  uVar288 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar121._4_4_ = uVar288;
  auVar121._0_4_ = uVar288;
  auVar121._8_4_ = uVar288;
  auVar121._12_4_ = uVar288;
  auVar74 = maxps(auVar74,auVar121);
  auVar74 = maxps(auVar146,auVar74);
  local_48 = auVar74._0_4_ * 0.99999964;
  fStack_44 = auVar74._4_4_ * 0.99999964;
  fStack_40 = auVar74._8_4_ * 0.99999964;
  fStack_3c = auVar74._12_4_ * 0.99999964;
  auVar74 = maxps(auVar161,auVar216);
  auVar146 = maxps(auVar228,auVar236);
  auVar74 = minps(auVar74,auVar146);
  auVar146 = maxps(auVar246,auVar263);
  fVar155 = (ray->super_RayK<1>).tfar;
  auVar95._4_4_ = fVar155;
  auVar95._0_4_ = fVar155;
  auVar95._8_4_ = fVar155;
  auVar95._12_4_ = fVar155;
  auVar146 = minps(auVar146,auVar95);
  auVar74 = minps(auVar74,auVar146);
  uVar65 = (uint)(byte)PVar18;
  auVar122._0_4_ = -(uint)(uVar65 != 0 && local_48 <= auVar74._0_4_ * 1.0000004);
  auVar122._4_4_ = -(uint)(1 < uVar65 && fStack_44 <= auVar74._4_4_ * 1.0000004);
  auVar122._8_4_ = -(uint)(2 < uVar65 && fStack_40 <= auVar74._8_4_ * 1.0000004);
  auVar122._12_4_ = -(uint)(3 < uVar65 && fStack_3c <= auVar74._12_4_ * 1.0000004);
  uVar65 = movmskps(uVar65,auVar122);
  if (uVar65 != 0) {
    uVar65 = uVar65 & 0xff;
    local_2a8 = mm_lookupmask_ps._0_8_;
    uStack_2a0 = mm_lookupmask_ps._8_8_;
    local_2f8 = prim;
    local_2f0 = pre;
    do {
      lVar24 = 0;
      if (uVar65 != 0) {
        for (; (uVar65 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
        }
      }
      local_3d0 = (RTCIntersectArguments *)(ulong)*(uint *)(prim + 2);
      local_3a0 = (ulong)*(uint *)(prim + lVar24 * 4 + 6);
      pGVar20 = (context->scene->geometries).items[(long)local_3d0].ptr;
      uVar57 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                               local_3a0 *
                               pGVar20[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      local_3f8 = pGVar20->fnumTimeSegments;
      fVar155 = (pGVar20->time_range).lower;
      fVar155 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar155) /
                ((pGVar20->time_range).upper - fVar155)) * pGVar20->fnumTimeSegments;
      _local_3e8 = ZEXT416((uint)fVar155);
      fVar155 = floorf(fVar155);
      if (local_3f8 + -1.0 <= fVar155) {
        fVar155 = local_3f8 + -1.0;
      }
      fVar72 = 0.0;
      if (0.0 <= fVar155) {
        fVar72 = fVar155;
      }
      _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar55 = (long)(int)fVar72 * 0x38;
      lVar64 = *(long *)(_Var21 + 0x10 + lVar55);
      lVar63 = *(long *)(_Var21 + 0x38 + lVar55);
      lVar22 = *(long *)(_Var21 + 0x48 + lVar55);
      pfVar1 = (float *)(lVar63 + lVar22 * uVar57);
      lVar24 = uVar57 + 1;
      pfVar2 = (float *)(lVar63 + lVar22 * lVar24);
      p_Var23 = pGVar20[4].occlusionFilterN;
      pfVar3 = (float *)(*(long *)(_Var21 + lVar55) + lVar64 * uVar57);
      pfVar4 = (float *)(*(long *)(_Var21 + lVar55) + lVar64 * lVar24);
      pfVar5 = (float *)(*(long *)(p_Var23 + lVar55 + 0x38) +
                        uVar57 * *(long *)(p_Var23 + lVar55 + 0x48));
      fVar72 = (float)local_3e8._0_4_ - fVar72;
      fVar155 = 1.0 - fVar72;
      uVar61 = *(long *)(p_Var23 + lVar55 + 0x48) * lVar24;
      pfVar6 = (float *)(*(long *)(p_Var23 + lVar55 + 0x38) + uVar61);
      local_318 = *pfVar3 * fVar155 + *pfVar1 * fVar72;
      fStack_314 = pfVar3[1] * fVar155 + pfVar1[1] * fVar72;
      fStack_310 = pfVar3[2] * fVar155 + pfVar1[2] * fVar72;
      fStack_30c = pfVar3[3] * fVar155 + pfVar1[3] * fVar72;
      pfVar1 = (float *)(*(long *)(p_Var23 + lVar55) + *(long *)(p_Var23 + lVar55 + 0x10) * uVar57);
      local_278 = *pfVar4 * fVar155 + *pfVar2 * fVar72;
      fStack_274 = pfVar4[1] * fVar155 + pfVar2[1] * fVar72;
      fStack_270 = pfVar4[2] * fVar155 + pfVar2[2] * fVar72;
      fStack_26c = pfVar4[3] * fVar155 + pfVar2[3] * fVar72;
      pfVar2 = (float *)(*(long *)(p_Var23 + lVar55) + *(long *)(p_Var23 + lVar55 + 0x10) * lVar24);
      local_288 = (*pfVar1 * fVar155 + *pfVar5 * fVar72) * 0.33333334 + local_318;
      fStack_284 = (pfVar1[1] * fVar155 + pfVar5[1] * fVar72) * 0.33333334 + fStack_314;
      fStack_280 = (pfVar1[2] * fVar155 + pfVar5[2] * fVar72) * 0.33333334 + fStack_310;
      fStack_27c = (pfVar1[3] * fVar155 + pfVar5[3] * fVar72) * 0.33333334 + fStack_30c;
      local_298 = local_278 - (fVar155 * *pfVar2 + fVar72 * *pfVar6) * 0.33333334;
      fStack_294 = fStack_274 - (fVar155 * pfVar2[1] + fVar72 * pfVar6[1]) * 0.33333334;
      fStack_290 = fStack_270 - (fVar155 * pfVar2[2] + fVar72 * pfVar6[2]) * 0.33333334;
      fStack_28c = fStack_26c - (fVar155 * pfVar2[3] + fVar72 * pfVar6[3]) * 0.33333334;
      local_1c8 = (ray->super_RayK<1>).org.field_0.m128[0];
      fStack_1c4 = (ray->super_RayK<1>).org.field_0.m128[1];
      fStack_1c0 = (ray->super_RayK<1>).org.field_0.m128[2];
      fStack_1bc = (ray->super_RayK<1>).org.field_0.m128[3];
      fVar156 = local_318 - local_1c8;
      fVar172 = fStack_314 - fStack_1c4;
      fVar173 = fStack_310 - fStack_1c0;
      fVar155 = (local_2f0->ray_space).vx.field_0.m128[0];
      fVar72 = (local_2f0->ray_space).vx.field_0.m128[1];
      fVar108 = (local_2f0->ray_space).vx.field_0.m128[2];
      fVar109 = (local_2f0->ray_space).vy.field_0.m128[0];
      fVar110 = (local_2f0->ray_space).vy.field_0.m128[1];
      fVar139 = (local_2f0->ray_space).vy.field_0.m128[2];
      fVar141 = (local_2f0->ray_space).vz.field_0.m128[0];
      fVar144 = (local_2f0->ray_space).vz.field_0.m128[1];
      fVar154 = (local_2f0->ray_space).vz.field_0.m128[2];
      local_178 = fVar156 * fVar155 + fVar172 * fVar109 + fVar173 * fVar141;
      local_188 = fVar156 * fVar72 + fVar172 * fVar110 + fVar173 * fVar144;
      local_3e8._4_4_ = fVar156 * fVar108 + fVar172 * fVar139 + fVar173 * fVar154;
      fVar156 = local_288 - local_1c8;
      fVar172 = fStack_284 - fStack_1c4;
      fVar173 = fStack_280 - fStack_1c0;
      fVar180 = fVar156 * fVar155 + fVar172 * fVar109 + fVar173 * fVar141;
      aStack_42c.m128[1] = fVar156 * fVar72 + fVar172 * fVar110 + fVar173 * fVar144;
      local_258 = fVar156 * fVar108 + fVar172 * fVar139 + fVar173 * fVar154;
      fVar172 = local_298 - local_1c8;
      fVar173 = fStack_294 - fStack_1c4;
      fVar174 = fStack_290 - fStack_1c0;
      local_388 = fVar172 * fVar155 + fVar173 * fVar109 + fVar174 * fVar141;
      fVar156 = fVar172 * fVar72 + fVar173 * fVar110 + fVar174 * fVar144;
      local_218 = fVar172 * fVar108 + fVar173 * fVar139 + fVar174 * fVar154;
      fVar172 = local_278 - local_1c8;
      fVar173 = fStack_274 - fStack_1c4;
      fVar174 = fStack_270 - fStack_1c0;
      iVar19 = (int)pGVar20[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_418 = fVar172 * fVar155 + fVar173 * fVar109 + fVar174 * fVar141;
      uVar288 = fVar172 * fVar72 + fVar173 * fVar110 + fVar174 * fVar144;
      local_228 = fVar172 * fVar108 + fVar173 * fVar139 + fVar174 * fVar154;
      auVar264._0_8_ = CONCAT44(local_188,local_178) & 0x7fffffff7fffffff;
      auVar264._8_4_ = ABS((float)local_3e8._4_4_);
      auVar264._12_4_ = ABS(fStack_30c);
      auVar162._0_8_ = CONCAT44(aStack_42c.m128[1],fVar180) & 0x7fffffff7fffffff;
      auVar162._8_4_ = ABS(local_258);
      auVar162._12_4_ = ABS(fStack_27c);
      auVar146 = maxps(auVar264,auVar162);
      auVar175._0_8_ = CONCAT44(fVar156,local_388) & 0x7fffffff7fffffff;
      auVar175._8_4_ = ABS(local_218);
      auVar175._12_4_ = ABS(fStack_28c);
      auVar123._0_8_ = CONCAT44(uVar288,local_418) & 0x7fffffff7fffffff;
      auVar123._8_4_ = ABS(local_228);
      auVar123._12_4_ = ABS(fStack_26c);
      auVar74 = maxps(auVar175,auVar123);
      auVar74 = maxps(auVar146,auVar74);
      fVar155 = auVar74._4_4_;
      if (auVar74._4_4_ <= auVar74._0_4_) {
        fVar155 = auVar74._0_4_;
      }
      fVar72 = (float)iVar19;
      auVar265._8_8_ = auVar74._8_8_;
      auVar265._0_8_ = auVar74._8_8_;
      if (auVar74._8_4_ <= fVar155) {
        auVar265._0_4_ = fVar155;
      }
      _local_1d8 = ZEXT416((uint)fVar72);
      local_398._4_4_ = -(uint)(1.0 < fVar72);
      local_398._0_4_ = -(uint)(0.0 < fVar72);
      fStack_390 = (float)-(uint)(2.0 < fVar72);
      fStack_38c = (float)-(uint)(3.0 < fVar72);
      iVar58 = iVar19 * 0x40;
      lVar24 = (long)iVar19 * 0x44;
      fStack_384 = local_388;
      fStack_380 = local_388;
      fStack_37c = local_388;
      fVar155 = *(float *)*(undefined1 (*) [12])(bezier_basis0 + lVar24 + 0xd8c);
      fVar108 = *(float *)(bezier_basis0 + lVar24 + 0xd90);
      fVar109 = *(float *)(bezier_basis0 + lVar24 + 0xd94);
      auVar30 = *(undefined1 (*) [12])(bezier_basis0 + lVar24 + 0xd8c);
      fVar110 = *(float *)(bezier_basis0 + lVar24 + 0xd98);
      pauVar8 = (undefined1 (*) [16])(bezier_basis0 + lVar24 + 0x908);
      fVar139 = *(float *)*pauVar8;
      fVar141 = *(float *)(bezier_basis0 + lVar24 + 0x90c);
      fVar144 = *(float *)(bezier_basis0 + lVar24 + 0x910);
      auVar31 = *(undefined1 (*) [12])*pauVar8;
      fVar154 = *(float *)(bezier_basis0 + lVar24 + 0x914);
      _local_348 = *pauVar8;
      local_3c8 = fVar156;
      fStack_3c4 = fVar156;
      fStack_3c0 = fVar156;
      fStack_3bc = fVar156;
      local_168 = fStack_28c;
      fStack_164 = fStack_28c;
      fStack_160 = fStack_28c;
      fStack_15c = fStack_28c;
      local_358 = *(float *)(bezier_basis0 + lVar24 + 0x484);
      fStack_354 = *(float *)(bezier_basis0 + lVar24 + 0x488);
      fStack_350 = *(float *)(bezier_basis0 + lVar24 + 0x48c);
      fStack_34c = *(float *)(bezier_basis0 + lVar24 + 0x490);
      local_368 = *(float *)(bezier_basis0 + lVar24);
      fStack_364 = *(float *)(bezier_basis0 + lVar24 + 4);
      fStack_360 = *(float *)(bezier_basis0 + lVar24 + 8);
      fStack_35c = *(float *)(bezier_basis0 + lVar24 + 0xc);
      local_248._0_4_ =
           local_178 * local_368 + fVar180 * local_358 + local_388 * fVar139 + local_418 * fVar155;
      local_248._4_4_ =
           local_178 * fStack_364 + fVar180 * fStack_354 + local_388 * fVar141 + local_418 * fVar108
      ;
      fStack_240 = local_178 * fStack_360 +
                   fVar180 * fStack_350 + local_388 * fVar144 + local_418 * fVar109;
      fStack_23c = local_178 * fStack_35c +
                   fVar180 * fStack_34c + local_388 * fVar154 + local_418 * fVar110;
      local_198 = local_188 * local_368 +
                  aStack_42c.m128[1] * local_358 + fVar156 * fVar139 + (float)uVar288 * fVar155;
      fStack_194 = local_188 * fStack_364 +
                   aStack_42c.m128[1] * fStack_354 + fVar156 * fVar141 + (float)uVar288 * fVar108;
      fStack_190 = local_188 * fStack_360 +
                   aStack_42c.m128[1] * fStack_350 + fVar156 * fVar144 + (float)uVar288 * fVar109;
      fStack_18c = local_188 * fStack_35c +
                   aStack_42c.m128[1] * fStack_34c + fVar156 * fVar154 + (float)uVar288 * fVar110;
      local_238._0_4_ =
           fStack_30c * local_368 +
           fStack_27c * local_358 + fStack_28c * fVar139 + fStack_26c * fVar155;
      local_238._4_4_ =
           fStack_30c * fStack_364 +
           fStack_27c * fStack_354 + fStack_28c * fVar141 + fStack_26c * fVar108;
      local_238._8_4_ =
           fStack_30c * fStack_360 +
           fStack_27c * fStack_350 + fStack_28c * fVar144 + fStack_26c * fVar109;
      local_238._12_4_ =
           fStack_30c * fStack_35c +
           fStack_27c * fStack_34c + fStack_28c * fVar154 + fStack_26c * fVar110;
      fVar155 = *(float *)(bezier_basis1 + lVar24 + 0xd8c);
      fVar108 = *(float *)(bezier_basis1 + lVar24 + 0xd90);
      unique0x10004c07 = *(undefined8 *)(bezier_basis1 + lVar24 + 0xd8c);
      uStack_430 = *(undefined4 *)(bezier_basis1 + lVar24 + 0xd94);
      aStack_42c.m128[0] = (float)*(undefined4 *)(bezier_basis1 + lVar24 + 0xd98);
      fStack_414 = local_418;
      fStack_410 = local_418;
      aStack_40c.field_0.x = local_418;
      fVar109 = *(float *)(bezier_basis1 + lVar24 + 0x908);
      fVar139 = *(float *)(bezier_basis1 + lVar24 + 0x90c);
      fVar141 = *(float *)(bezier_basis1 + lVar24 + 0x910);
      fVar144 = *(float *)(bezier_basis1 + lVar24 + 0x914);
      aStack_40c.field_0.y = (float)uVar288;
      aStack_40c.field_0.z = (float)uVar288;
      fStack_400 = (float)uVar288;
      fStack_3fc = (float)uVar288;
      local_58 = fStack_26c;
      fStack_54 = fStack_26c;
      fStack_50 = fStack_26c;
      fStack_4c = fStack_26c;
      fVar172 = *(float *)(bezier_basis1 + lVar24 + 0x484);
      fVar173 = *(float *)(bezier_basis1 + lVar24 + 0x488);
      fVar174 = *(float *)(bezier_basis1 + lVar24 + 0x48c);
      fVar181 = *(float *)(bezier_basis1 + lVar24 + 0x490);
      aStack_42c.m128[2] = aStack_42c.m128[1];
      aStack_42c.m128[3] = aStack_42c.m128[1];
      fStack_41c = aStack_42c.m128[1];
      local_88 = fStack_27c;
      fStack_84 = fStack_27c;
      fStack_80 = fStack_27c;
      fStack_7c = fStack_27c;
      fVar182 = *(float *)(bezier_basis1 + lVar24);
      fVar203 = *(float *)(bezier_basis1 + lVar24 + 4);
      fVar204 = *(float *)(bezier_basis1 + lVar24 + 8);
      fVar205 = *(float *)(bezier_basis1 + lVar24 + 0xc);
      fStack_174 = local_178;
      fStack_170 = local_178;
      fStack_16c = local_178;
      local_3b8 = local_178 * fVar182 +
                  fVar180 * fVar172 + local_388 * fVar109 + local_418 * fVar155;
      fStack_3b4 = local_178 * fVar203 +
                   fVar180 * fVar173 + local_388 * fVar139 + local_418 * fVar108;
      fStack_3b0 = local_178 * fVar204 +
                   fVar180 * fVar174 + local_388 * fVar141 + local_418 * (float)uStack_430;
      fStack_3ac = local_178 * fVar205 +
                   fVar180 * fVar181 + local_388 * fVar144 + local_418 * aStack_42c.m128[0];
      fStack_184 = local_188;
      fStack_180 = local_188;
      fStack_17c = local_188;
      local_268._0_4_ =
           local_188 * fVar182 +
           aStack_42c.m128[1] * fVar172 + fVar156 * fVar109 + (float)uVar288 * fVar155;
      local_268._4_4_ =
           local_188 * fVar203 +
           aStack_42c.m128[1] * fVar173 + fVar156 * fVar139 + (float)uVar288 * fVar108;
      fStack_260 = local_188 * fVar204 +
                   aStack_42c.m128[1] * fVar174 +
                   fVar156 * fVar141 + (float)uVar288 * (float)uStack_430;
      fStack_25c = local_188 * fVar205 +
                   aStack_42c.m128[1] * fVar181 +
                   fVar156 * fVar144 + (float)uVar288 * aStack_42c.m128[0];
      local_98 = fStack_30c;
      fStack_94 = fStack_30c;
      fStack_90 = fStack_30c;
      fStack_8c = fStack_30c;
      auVar247._0_4_ =
           fStack_30c * fVar182 + fStack_27c * fVar172 + fStack_28c * fVar109 + fStack_26c * fVar155
      ;
      auVar247._4_4_ =
           fStack_30c * fVar203 + fStack_27c * fVar173 + fStack_28c * fVar139 + fStack_26c * fVar108
      ;
      auVar247._8_4_ =
           fStack_30c * fVar204 +
           fStack_27c * fVar174 + fStack_28c * fVar141 + fStack_26c * (float)uStack_430;
      auVar247._12_4_ =
           fStack_30c * fVar205 +
           fStack_27c * fVar181 + fStack_28c * fVar144 + fStack_26c * aStack_42c.m128[0];
      fVar238 = local_3b8 - (float)local_248._0_4_;
      fVar239 = fStack_3b4 - (float)local_248._4_4_;
      fVar249 = fStack_3b0 - fStack_240;
      fVar252 = fStack_3ac - fStack_23c;
      fVar222 = (float)local_268._0_4_ - local_198;
      fVar223 = (float)local_268._4_4_ - fStack_194;
      fVar232 = fStack_260 - fStack_190;
      fVar237 = fStack_25c - fStack_18c;
      fVar209 = local_198 * fVar238 - (float)local_248._0_4_ * fVar222;
      fVar210 = fStack_194 * fVar239 - (float)local_248._4_4_ * fVar223;
      fVar211 = fStack_190 * fVar249 - fStack_240 * fVar232;
      fVar219 = fStack_18c * fVar252 - fStack_23c * fVar237;
      auVar74 = maxps(local_238,auVar247);
      bVar27 = fVar209 * fVar209 <=
               auVar74._0_4_ * auVar74._0_4_ * (fVar238 * fVar238 + fVar222 * fVar222) &&
               0.0 < fVar72;
      auVar217._0_4_ = -(uint)bVar27;
      bVar51 = fVar210 * fVar210 <=
               auVar74._4_4_ * auVar74._4_4_ * (fVar239 * fVar239 + fVar223 * fVar223) &&
               1.0 < fVar72;
      auVar217._4_4_ = -(uint)bVar51;
      bVar26 = fVar211 * fVar211 <=
               auVar74._8_4_ * auVar74._8_4_ * (fVar249 * fVar249 + fVar232 * fVar232) &&
               2.0 < fVar72;
      auVar217._8_4_ = -(uint)bVar26;
      bVar25 = fVar219 * fVar219 <=
               auVar74._12_4_ * auVar74._12_4_ * (fVar252 * fVar252 + fVar237 * fVar237) &&
               3.0 < fVar72;
      auVar217._12_4_ = -(uint)bVar25;
      local_3f8 = auVar265._0_4_;
      fStack_3f4 = auVar265._4_4_;
      auStack_3f0[0] = auVar265._8_4_;
      auStack_3ec[0] = auVar265._12_4_;
      fVar220 = local_3f8 * 4.7683716e-07;
      local_3f8 = fVar220;
      iVar52 = movmskps(iVar19,auVar217);
      local_3e8._0_4_ = local_3e8._4_4_;
      fStack_3e0 = (float)local_3e8._4_4_;
      fStack_3dc = (float)local_3e8._4_4_;
      fStack_254 = local_258;
      fStack_250 = local_258;
      fStack_24c = local_258;
      fStack_214 = local_218;
      fStack_210 = local_218;
      fStack_20c = local_218;
      fStack_224 = local_228;
      fStack_220 = local_228;
      fStack_21c = local_228;
      fVar209 = local_338;
      fVar210 = fStack_334;
      fVar211 = fStack_330;
      fVar219 = fStack_32c;
      fVar224 = fVar156;
      fVar229 = fVar156;
      fVar231 = fVar156;
      uVar230 = uVar288;
      fVar272 = (float)uVar288;
      fVar221 = (float)uVar288;
      if (iVar52 != 0) {
        local_43c._4_4_ =
             fVar155 * local_228 + fVar109 * local_218 + fVar172 * local_258 +
             fVar182 * (float)local_3e8._4_4_;
        fStack_434 = fVar108 * local_228 + fVar139 * local_218 + fVar173 * local_258 +
                     fVar203 * (float)local_3e8._4_4_;
        uStack_430 = (float)uStack_430 * local_228 + fVar141 * local_218 + fVar174 * local_258 +
                     fVar204 * (float)local_3e8._4_4_;
        aStack_42c.m128[0] =
             aStack_42c.m128[0] * local_228 + fVar144 * local_218 + fVar181 * local_258 +
             fVar205 * (float)local_3e8._4_4_;
        local_348._0_4_ = auVar31._0_4_;
        local_348._4_4_ = auVar31._4_4_;
        fStack_340 = auVar31._8_4_;
        fVar155 = (float)local_348._0_4_ * local_218;
        fVar108 = (float)local_348._4_4_ * local_218;
        fVar109 = fStack_340 * local_218;
        _local_348 = auVar217;
        local_468._0_4_ = auVar30._0_4_;
        local_468._4_4_ = auVar30._4_4_;
        fStack_460 = auVar30._8_4_;
        fVar111 = (float)local_468._0_4_ * local_228 + fVar155 + local_358 * local_258 +
                  local_368 * (float)local_3e8._4_4_;
        fVar140 = (float)local_468._4_4_ * local_228 + fVar108 + fStack_354 * local_258 +
                  fStack_364 * (float)local_3e8._4_4_;
        fVar142 = fStack_460 * local_228 + fVar109 + fStack_350 * local_258 +
                  fStack_360 * (float)local_3e8._4_4_;
        fVar143 = fVar110 * local_228 + fVar154 * local_218 + fStack_34c * local_258 +
                  fStack_35c * (float)local_3e8._4_4_;
        fVar155 = *(float *)(bezier_basis0 + lVar24 + 0x1210);
        fVar108 = *(float *)(bezier_basis0 + lVar24 + 0x1214);
        fVar109 = *(float *)(bezier_basis0 + lVar24 + 0x1218);
        fVar110 = *(float *)(bezier_basis0 + lVar24 + 0x121c);
        fVar139 = *(float *)(bezier_basis0 + lVar24 + 0x1694);
        fVar141 = *(float *)(bezier_basis0 + lVar24 + 0x1698);
        fVar144 = *(float *)(bezier_basis0 + lVar24 + 0x169c);
        fVar154 = *(float *)(bezier_basis0 + lVar24 + 0x16a0);
        fVar172 = *(float *)(bezier_basis0 + lVar24 + 0x1b18);
        fVar173 = *(float *)(bezier_basis0 + lVar24 + 0x1b1c);
        fVar174 = *(float *)(bezier_basis0 + lVar24 + 0x1b20);
        fVar181 = *(float *)(bezier_basis0 + lVar24 + 0x1b24);
        fVar182 = *(float *)(bezier_basis0 + lVar24 + 0x1f9c);
        fVar203 = *(float *)(bezier_basis0 + lVar24 + 0x1fa0);
        fVar204 = *(float *)(bezier_basis0 + lVar24 + 0x1fa4);
        fVar205 = *(float *)(bezier_basis0 + lVar24 + 0x1fa8);
        _local_398 = auVar247;
        fVar240 = local_178 * fVar155 +
                  fVar180 * fVar139 + local_388 * fVar172 + local_418 * fVar182;
        fVar250 = local_178 * fVar108 +
                  fVar180 * fVar141 + local_388 * fVar173 + local_418 * fVar203;
        fVar253 = local_178 * fVar109 +
                  fVar180 * fVar144 + local_388 * fVar174 + local_418 * fVar204;
        fVar256 = local_178 * fVar110 +
                  fVar180 * fVar154 + local_388 * fVar181 + local_418 * fVar205;
        fVar295 = local_188 * fVar155 +
                  aStack_42c.m128[1] * fVar139 + fVar156 * fVar172 + (float)uVar288 * fVar182;
        fVar298 = local_188 * fVar108 +
                  aStack_42c.m128[1] * fVar141 + fVar156 * fVar173 + (float)uVar288 * fVar203;
        fVar300 = local_188 * fVar109 +
                  aStack_42c.m128[1] * fVar144 + fVar156 * fVar174 + (float)uVar288 * fVar204;
        fVar302 = local_188 * fVar110 +
                  aStack_42c.m128[1] * fVar154 + fVar156 * fVar181 + (float)uVar288 * fVar205;
        fVar255 = *(float *)(bezier_basis1 + lVar24 + 0x1210);
        fVar258 = *(float *)(bezier_basis1 + lVar24 + 0x1214);
        fVar269 = *(float *)(bezier_basis1 + lVar24 + 0x1218);
        fVar270 = *(float *)(bezier_basis1 + lVar24 + 0x121c);
        fVar271 = *(float *)(bezier_basis1 + lVar24 + 0x1b18);
        fVar273 = *(float *)(bezier_basis1 + lVar24 + 0x1b1c);
        fVar278 = *(float *)(bezier_basis1 + lVar24 + 0x1b20);
        fVar280 = *(float *)(bezier_basis1 + lVar24 + 0x1b24);
        fVar282 = *(float *)(bezier_basis1 + lVar24 + 0x1f9c);
        fVar279 = *(float *)(bezier_basis1 + lVar24 + 0x1fa0);
        fVar281 = *(float *)(bezier_basis1 + lVar24 + 0x1fa4);
        fVar283 = *(float *)(bezier_basis1 + lVar24 + 0x1fa8);
        fVar297 = *(float *)(bezier_basis1 + lVar24 + 0x1694);
        fVar299 = *(float *)(bezier_basis1 + lVar24 + 0x1698);
        fVar301 = *(float *)(bezier_basis1 + lVar24 + 0x169c);
        fVar296 = *(float *)(bezier_basis1 + lVar24 + 0x16a0);
        auVar124._0_4_ = fVar271 * local_218 + fVar282 * local_228;
        auVar124._4_4_ = fVar273 * local_218 + fVar279 * local_228;
        auVar124._8_4_ = fVar278 * local_218 + fVar281 * local_228;
        auVar124._12_4_ = fVar280 * local_218 + fVar283 * local_228;
        fVar284 = local_178 * fVar255 +
                  fVar180 * fVar297 + local_388 * fVar271 + local_418 * fVar282;
        fVar289 = local_178 * fVar258 +
                  fVar180 * fVar299 + local_388 * fVar273 + local_418 * fVar279;
        fVar291 = local_178 * fVar269 +
                  fVar180 * fVar301 + local_388 * fVar278 + local_418 * fVar281;
        fVar293 = local_178 * fVar270 +
                  fVar180 * fVar296 + local_388 * fVar280 + local_418 * fVar283;
        fVar271 = local_188 * fVar255 +
                  aStack_42c.m128[1] * fVar297 + fVar156 * fVar271 + (float)uVar288 * fVar282;
        fVar273 = local_188 * fVar258 +
                  aStack_42c.m128[1] * fVar299 + fVar156 * fVar273 + (float)uVar288 * fVar279;
        fVar278 = local_188 * fVar269 +
                  aStack_42c.m128[1] * fVar301 + fVar156 * fVar278 + (float)uVar288 * fVar281;
        fVar280 = local_188 * fVar270 +
                  aStack_42c.m128[1] * fVar296 + fVar156 * fVar280 + (float)uVar288 * fVar283;
        auVar266._0_8_ = CONCAT44(fVar250,fVar240) & 0x7fffffff7fffffff;
        auVar266._8_4_ = ABS(fVar253);
        auVar266._12_4_ = ABS(fVar256);
        auVar96._0_8_ = CONCAT44(fVar298,fVar295) & 0x7fffffff7fffffff;
        auVar96._8_4_ = ABS(fVar300);
        auVar96._12_4_ = ABS(fVar302);
        auVar74 = maxps(auVar266,auVar96);
        auVar274._0_8_ =
             CONCAT44(fVar108 * (float)local_3e8._4_4_ +
                      fVar141 * local_258 + fVar173 * local_218 + fVar203 * local_228,
                      fVar155 * (float)local_3e8._4_4_ +
                      fVar139 * local_258 + fVar172 * local_218 + fVar182 * local_228) &
             0x7fffffff7fffffff;
        auVar274._8_4_ =
             ABS(fVar109 * (float)local_3e8._4_4_ +
                 fVar144 * local_258 + fVar174 * local_218 + fVar204 * local_228);
        auVar274._12_4_ =
             ABS(fVar110 * (float)local_3e8._4_4_ +
                 fVar154 * local_258 + fVar181 * local_218 + fVar205 * local_228);
        auVar74 = maxps(auVar74,auVar274);
        uVar66 = -(uint)(fVar220 <= auVar74._0_4_);
        uVar67 = -(uint)(fVar220 <= auVar74._4_4_);
        uVar68 = -(uint)(fVar220 <= auVar74._8_4_);
        uVar69 = -(uint)(fVar220 <= auVar74._12_4_);
        fVar141 = (float)((uint)fVar240 & uVar66 | ~uVar66 & (uint)fVar238);
        fVar154 = (float)((uint)fVar250 & uVar67 | ~uVar67 & (uint)fVar239);
        fVar173 = (float)((uint)fVar253 & uVar68 | ~uVar68 & (uint)fVar249);
        fVar174 = (float)((uint)fVar256 & uVar69 | ~uVar69 & (uint)fVar252);
        fVar181 = (float)(~uVar66 & (uint)fVar222 | (uint)fVar295 & uVar66);
        fVar182 = (float)(~uVar67 & (uint)fVar223 | (uint)fVar298 & uVar67);
        fVar203 = (float)(~uVar68 & (uint)fVar232 | (uint)fVar300 & uVar68);
        fVar204 = (float)(~uVar69 & (uint)fVar237 | (uint)fVar302 & uVar69);
        auVar275._0_8_ = CONCAT44(fVar289,fVar284) & 0x7fffffff7fffffff;
        auVar275._8_4_ = ABS(fVar291);
        auVar275._12_4_ = ABS(fVar293);
        auVar28._8_4_ = ABS(fVar278);
        auVar28._0_8_ = CONCAT44(fVar273,fVar271) & 0x7fffffff7fffffff;
        auVar28._12_4_ = ABS(fVar280);
        auVar74 = maxps(auVar275,auVar28);
        auVar207._0_8_ =
             CONCAT44(fVar258 * (float)local_3e8._4_4_ + fVar299 * local_258 + auVar124._4_4_,
                      fVar255 * (float)local_3e8._4_4_ + fVar297 * local_258 + auVar124._0_4_) &
             0x7fffffff7fffffff;
        auVar207._8_4_ =
             ABS(fVar269 * (float)local_3e8._4_4_ + fVar301 * local_258 + auVar124._8_4_);
        auVar207._12_4_ =
             ABS(fVar270 * (float)local_3e8._4_4_ + fVar296 * local_258 + auVar124._12_4_);
        auVar74 = maxps(auVar74,auVar207);
        uVar66 = -(uint)(fVar220 <= auVar74._0_4_);
        uVar67 = -(uint)(fVar220 <= auVar74._4_4_);
        uVar68 = -(uint)(fVar220 <= auVar74._8_4_);
        uVar69 = -(uint)(fVar220 <= auVar74._12_4_);
        fVar270 = (float)((uint)fVar284 & uVar66 | ~uVar66 & (uint)fVar238);
        fVar297 = (float)((uint)fVar289 & uVar67 | ~uVar67 & (uint)fVar239);
        fVar299 = (float)((uint)fVar291 & uVar68 | ~uVar68 & (uint)fVar249);
        fVar301 = (float)((uint)fVar293 & uVar69 | ~uVar69 & (uint)fVar252);
        fVar205 = (float)(~uVar66 & (uint)fVar222 | (uint)fVar271 & uVar66);
        fVar255 = (float)(~uVar67 & (uint)fVar223 | (uint)fVar273 & uVar67);
        fVar258 = (float)(~uVar68 & (uint)fVar232 | (uint)fVar278 & uVar68);
        fVar269 = (float)(~uVar69 & (uint)fVar237 | (uint)fVar280 & uVar69);
        auVar97._0_4_ = fVar181 * fVar181 + fVar141 * fVar141;
        auVar97._4_4_ = fVar182 * fVar182 + fVar154 * fVar154;
        auVar97._8_4_ = fVar203 * fVar203 + fVar173 * fVar173;
        auVar97._12_4_ = fVar204 * fVar204 + fVar174 * fVar174;
        auVar74 = rsqrtps(auVar124,auVar97);
        fVar155 = auVar74._0_4_;
        fVar108 = auVar74._4_4_;
        fVar109 = auVar74._8_4_;
        fVar110 = auVar74._12_4_;
        auVar125._0_4_ = fVar155 * fVar155 * auVar97._0_4_ * 0.5 * fVar155;
        auVar125._4_4_ = fVar108 * fVar108 * auVar97._4_4_ * 0.5 * fVar108;
        auVar125._8_4_ = fVar109 * fVar109 * auVar97._8_4_ * 0.5 * fVar109;
        auVar125._12_4_ = fVar110 * fVar110 * auVar97._12_4_ * 0.5 * fVar110;
        fVar271 = fVar155 * 1.5 - auVar125._0_4_;
        fVar273 = fVar108 * 1.5 - auVar125._4_4_;
        fVar278 = fVar109 * 1.5 - auVar125._8_4_;
        fVar280 = fVar110 * 1.5 - auVar125._12_4_;
        auVar98._0_4_ = fVar205 * fVar205 + fVar270 * fVar270;
        auVar98._4_4_ = fVar255 * fVar255 + fVar297 * fVar297;
        auVar98._8_4_ = fVar258 * fVar258 + fVar299 * fVar299;
        auVar98._12_4_ = fVar269 * fVar269 + fVar301 * fVar301;
        auVar74 = rsqrtps(auVar125,auVar98);
        fVar155 = auVar74._0_4_;
        fVar108 = auVar74._4_4_;
        fVar109 = auVar74._8_4_;
        fVar110 = auVar74._12_4_;
        fVar155 = fVar155 * 1.5 - fVar155 * fVar155 * auVar98._0_4_ * 0.5 * fVar155;
        fVar139 = fVar108 * 1.5 - fVar108 * fVar108 * auVar98._4_4_ * 0.5 * fVar108;
        fVar144 = fVar109 * 1.5 - fVar109 * fVar109 * auVar98._8_4_ * 0.5 * fVar109;
        fVar172 = fVar110 * 1.5 - fVar110 * fVar110 * auVar98._12_4_ * 0.5 * fVar110;
        fVar223 = fVar181 * fVar271 * local_238._0_4_;
        fVar237 = fVar182 * fVar273 * local_238._4_4_;
        fVar239 = fVar203 * fVar278 * local_238._8_4_;
        fVar252 = fVar204 * fVar280 * local_238._12_4_;
        fVar222 = -fVar141 * fVar271 * local_238._0_4_;
        fVar232 = -fVar154 * fVar273 * local_238._4_4_;
        fVar238 = -fVar173 * fVar278 * local_238._8_4_;
        fVar249 = -fVar174 * fVar280 * local_238._12_4_;
        local_368 = local_198 + fVar222;
        fStack_364 = fStack_194 + fVar232;
        fStack_360 = fStack_190 + fVar238;
        fStack_35c = fStack_18c + fVar249;
        fVar296 = fVar271 * 0.0 * local_238._0_4_;
        fVar240 = fVar273 * 0.0 * local_238._4_4_;
        fVar250 = fVar278 * 0.0 * local_238._8_4_;
        fVar253 = fVar280 * 0.0 * local_238._12_4_;
        local_358 = fVar111 + fVar296;
        fStack_354 = fVar140 + fVar240;
        fStack_350 = fVar142 + fVar250;
        fStack_34c = fVar143 + fVar253;
        fVar282 = fVar205 * fVar155 * auVar247._0_4_;
        fVar279 = fVar255 * fVar139 * auVar247._4_4_;
        fVar281 = fVar258 * fVar144 * auVar247._8_4_;
        fVar283 = fVar269 * fVar172 * auVar247._12_4_;
        fVar271 = local_3b8 + fVar282;
        fVar273 = fStack_3b4 + fVar279;
        fVar278 = fStack_3b0 + fVar281;
        fVar280 = fStack_3ac + fVar283;
        fVar182 = -fVar270 * fVar155 * auVar247._0_4_;
        fVar203 = -fVar297 * fVar139 * auVar247._4_4_;
        fVar204 = -fVar299 * fVar144 * auVar247._8_4_;
        fVar205 = -fVar301 * fVar172 * auVar247._12_4_;
        fVar108 = (float)local_268._0_4_ + fVar182;
        fVar110 = (float)local_268._4_4_ + fVar203;
        fVar141 = fStack_260 + fVar204;
        fVar154 = fStack_25c + fVar205;
        fVar155 = fVar155 * 0.0 * auVar247._0_4_;
        fVar109 = fVar139 * 0.0 * auVar247._4_4_;
        fVar139 = fVar144 * 0.0 * auVar247._8_4_;
        fVar144 = fVar172 * 0.0 * auVar247._12_4_;
        fVar172 = (float)local_248._0_4_ - fVar223;
        fVar173 = (float)local_248._4_4_ - fVar237;
        fVar174 = fStack_240 - fVar239;
        fVar181 = fStack_23c - fVar252;
        fVar255 = (float)local_43c._4_4_ + fVar155;
        fVar258 = fStack_434 + fVar109;
        fVar269 = (float)uStack_430 + fVar139;
        fVar270 = aStack_42c.m128[0] + fVar144;
        fVar222 = local_198 - fVar222;
        fVar232 = fStack_194 - fVar232;
        fVar238 = fStack_190 - fVar238;
        fVar249 = fStack_18c - fVar249;
        fVar111 = fVar111 - fVar296;
        fVar140 = fVar140 - fVar240;
        fVar142 = fVar142 - fVar250;
        fVar143 = fVar143 - fVar253;
        uVar66 = -(uint)(0.0 < (fVar222 * (fVar255 - fVar111) - fVar111 * (fVar108 - fVar222)) * 0.0
                               + (fVar111 * (fVar271 - fVar172) - (fVar255 - fVar111) * fVar172) *
                                 0.0 + ((fVar108 - fVar222) * fVar172 -
                                       (fVar271 - fVar172) * fVar222));
        uVar67 = -(uint)(0.0 < (fVar232 * (fVar258 - fVar140) - fVar140 * (fVar110 - fVar232)) * 0.0
                               + (fVar140 * (fVar273 - fVar173) - (fVar258 - fVar140) * fVar173) *
                                 0.0 + ((fVar110 - fVar232) * fVar173 -
                                       (fVar273 - fVar173) * fVar232));
        uVar68 = -(uint)(0.0 < (fVar238 * (fVar269 - fVar142) - fVar142 * (fVar141 - fVar238)) * 0.0
                               + (fVar142 * (fVar278 - fVar174) - (fVar269 - fVar142) * fVar174) *
                                 0.0 + ((fVar141 - fVar238) * fVar174 -
                                       (fVar278 - fVar174) * fVar238));
        uVar69 = -(uint)(0.0 < (fVar249 * (fVar270 - fVar143) - fVar143 * (fVar154 - fVar249)) * 0.0
                               + (fVar143 * (fVar280 - fVar181) - (fVar270 - fVar143) * fVar181) *
                                 0.0 + ((fVar154 - fVar249) * fVar181 -
                                       (fVar280 - fVar181) * fVar249));
        local_3b8 = (float)((uint)(local_3b8 - fVar282) & uVar66 |
                           ~uVar66 & (uint)((float)local_248._0_4_ + fVar223));
        fStack_3b4 = (float)((uint)(fStack_3b4 - fVar279) & uVar67 |
                            ~uVar67 & (uint)((float)local_248._4_4_ + fVar237));
        fStack_3b0 = (float)((uint)(fStack_3b0 - fVar281) & uVar68 |
                            ~uVar68 & (uint)(fStack_240 + fVar239));
        fStack_3ac = (float)((uint)(fStack_3ac - fVar283) & uVar69 |
                            ~uVar69 & (uint)(fStack_23c + fVar252));
        local_268._0_4_ =
             (uint)((float)local_268._0_4_ - fVar182) & uVar66 | ~uVar66 & (uint)local_368;
        local_268._4_4_ =
             (uint)((float)local_268._4_4_ - fVar203) & uVar67 | ~uVar67 & (uint)fStack_364;
        fStack_260 = (float)((uint)(fStack_260 - fVar204) & uVar68 | ~uVar68 & (uint)fStack_360);
        fStack_25c = (float)((uint)(fStack_25c - fVar205) & uVar69 | ~uVar69 & (uint)fStack_35c);
        fVar155 = (float)((uint)((float)local_43c._4_4_ - fVar155) & uVar66 |
                         ~uVar66 & (uint)local_358);
        fVar109 = (float)((uint)(fStack_434 - fVar109) & uVar67 | ~uVar67 & (uint)fStack_354);
        fVar139 = (float)((uint)((float)uStack_430 - fVar139) & uVar68 | ~uVar68 & (uint)fStack_350)
        ;
        fVar144 = (float)((uint)(aStack_42c.m128[0] - fVar144) & uVar69 | ~uVar69 & (uint)fStack_34c
                         );
        fVar182 = (float)((uint)fVar172 & uVar66 | ~uVar66 & (uint)fVar271);
        fVar203 = (float)((uint)fVar173 & uVar67 | ~uVar67 & (uint)fVar273);
        fVar204 = (float)((uint)fVar174 & uVar68 | ~uVar68 & (uint)fVar278);
        fVar205 = (float)((uint)fVar181 & uVar69 | ~uVar69 & (uint)fVar280);
        fVar223 = (float)((uint)fVar222 & uVar66 | ~uVar66 & (uint)fVar108);
        fVar237 = (float)((uint)fVar232 & uVar67 | ~uVar67 & (uint)fVar110);
        fVar239 = (float)((uint)fVar238 & uVar68 | ~uVar68 & (uint)fVar141);
        fVar252 = (float)((uint)fVar249 & uVar69 | ~uVar69 & (uint)fVar154);
        fVar282 = (float)((uint)fVar111 & uVar66 | ~uVar66 & (uint)fVar255);
        fVar279 = (float)((uint)fVar140 & uVar67 | ~uVar67 & (uint)fVar258);
        fVar281 = (float)((uint)fVar142 & uVar68 | ~uVar68 & (uint)fVar269);
        fVar283 = (float)((uint)fVar143 & uVar69 | ~uVar69 & (uint)fVar270);
        local_468._0_4_ = (float)((uint)fVar271 & uVar66 | ~uVar66 & (uint)fVar172) - local_3b8;
        local_468._4_4_ = (float)((uint)fVar273 & uVar67 | ~uVar67 & (uint)fVar173) - fStack_3b4;
        fStack_460 = (float)((uint)fVar278 & uVar68 | ~uVar68 & (uint)fVar174) - fStack_3b0;
        fStack_45c = (float)((uint)fVar280 & uVar69 | ~uVar69 & (uint)fVar181) - fStack_3ac;
        fVar172 = (float)((uint)fVar108 & uVar66 | ~uVar66 & (uint)fVar222) - (float)local_268._0_4_
        ;
        fVar173 = (float)((uint)fVar110 & uVar67 | ~uVar67 & (uint)fVar232) - (float)local_268._4_4_
        ;
        fVar174 = (float)((uint)fVar141 & uVar68 | ~uVar68 & (uint)fVar238) - fStack_260;
        fVar181 = (float)((uint)fVar154 & uVar69 | ~uVar69 & (uint)fVar249) - fStack_25c;
        fVar255 = (float)((uint)fVar255 & uVar66 | ~uVar66 & (uint)fVar111) - fVar155;
        fVar258 = (float)((uint)fVar258 & uVar67 | ~uVar67 & (uint)fVar140) - fVar109;
        fVar269 = (float)((uint)fVar269 & uVar68 | ~uVar68 & (uint)fVar142) - fVar139;
        fVar270 = (float)((uint)fVar270 & uVar69 | ~uVar69 & (uint)fVar143) - fVar144;
        fVar297 = local_3b8 - fVar182;
        fVar299 = fStack_3b4 - fVar203;
        fVar301 = fStack_3b0 - fVar204;
        fVar296 = fStack_3ac - fVar205;
        fVar222 = (float)local_268._0_4_ - fVar223;
        fVar232 = (float)local_268._4_4_ - fVar237;
        fVar238 = fStack_260 - fVar239;
        fVar249 = fStack_25c - fVar252;
        fVar108 = fVar155 - fVar282;
        fVar110 = fVar109 - fVar279;
        fVar141 = fVar139 - fVar281;
        fVar154 = fVar144 - fVar283;
        fVar271 = ((float)local_268._0_4_ * fVar255 - fVar155 * fVar172) * 0.0 +
                  (fVar155 * (float)local_468._0_4_ - local_3b8 * fVar255) * 0.0 +
                  (local_3b8 * fVar172 - (float)local_268._0_4_ * (float)local_468._0_4_);
        fVar273 = ((float)local_268._4_4_ * fVar258 - fVar109 * fVar173) * 0.0 +
                  (fVar109 * (float)local_468._4_4_ - fStack_3b4 * fVar258) * 0.0 +
                  (fStack_3b4 * fVar173 - (float)local_268._4_4_ * (float)local_468._4_4_);
        auVar163._4_4_ = fVar273;
        auVar163._0_4_ = fVar271;
        fVar278 = (fStack_260 * fVar269 - fVar139 * fVar174) * 0.0 +
                  (fVar139 * fStack_460 - fStack_3b0 * fVar269) * 0.0 +
                  (fStack_3b0 * fVar174 - fStack_260 * fStack_460);
        fVar280 = (fStack_25c * fVar270 - fVar144 * fVar181) * 0.0 +
                  (fVar144 * fStack_45c - fStack_3ac * fVar270) * 0.0 +
                  (fStack_3ac * fVar181 - fStack_25c * fStack_45c);
        auVar286._0_4_ =
             (fVar223 * fVar108 - fVar282 * fVar222) * 0.0 +
             (fVar282 * fVar297 - fVar182 * fVar108) * 0.0 + (fVar182 * fVar222 - fVar223 * fVar297)
        ;
        auVar286._4_4_ =
             (fVar237 * fVar110 - fVar279 * fVar232) * 0.0 +
             (fVar279 * fVar299 - fVar203 * fVar110) * 0.0 + (fVar203 * fVar232 - fVar237 * fVar299)
        ;
        auVar286._8_4_ =
             (fVar239 * fVar141 - fVar281 * fVar238) * 0.0 +
             (fVar281 * fVar301 - fVar204 * fVar141) * 0.0 + (fVar204 * fVar238 - fVar239 * fVar301)
        ;
        auVar286._12_4_ =
             (fVar252 * fVar154 - fVar283 * fVar249) * 0.0 +
             (fVar283 * fVar296 - fVar205 * fVar154) * 0.0 + (fVar205 * fVar249 - fVar252 * fVar296)
        ;
        auVar163._8_4_ = fVar278;
        auVar163._12_4_ = fVar280;
        auVar74 = maxps(auVar163,auVar286);
        bVar27 = auVar74._0_4_ <= 0.0 && bVar27;
        auVar164._0_4_ = -(uint)bVar27;
        bVar51 = auVar74._4_4_ <= 0.0 && bVar51;
        auVar164._4_4_ = -(uint)bVar51;
        bVar26 = auVar74._8_4_ <= 0.0 && bVar26;
        auVar164._8_4_ = -(uint)bVar26;
        bVar25 = auVar74._12_4_ <= 0.0 && bVar25;
        auVar164._12_4_ = -(uint)bVar25;
        iVar52 = movmskps(iVar52,auVar164);
        if (iVar52 == 0) {
LAB_00b244fb:
          auVar165._8_8_ = uStack_2a0;
          auVar165._0_8_ = local_2a8;
        }
        else {
          fVar182 = (ray->super_RayK<1>).tfar;
          fVar237 = fVar222 * fVar255 - fVar108 * fVar172;
          fVar239 = fVar232 * fVar258 - fVar110 * fVar173;
          fVar252 = fVar238 * fVar269 - fVar141 * fVar174;
          fVar282 = fVar249 * fVar270 - fVar154 * fVar181;
          fVar203 = fVar108 * (float)local_468._0_4_ - fVar255 * fVar297;
          fVar204 = fVar110 * (float)local_468._4_4_ - fVar258 * fVar299;
          fVar205 = fVar141 * fStack_460 - fVar269 * fVar301;
          fVar223 = fVar154 * fStack_45c - fVar270 * fVar296;
          fVar172 = fVar297 * fVar172 - fVar222 * (float)local_468._0_4_;
          fVar173 = fVar299 * fVar173 - fVar232 * (float)local_468._4_4_;
          fVar174 = fVar301 * fVar174 - fVar238 * fStack_460;
          fVar181 = fVar296 * fVar181 - fVar249 * fStack_45c;
          auVar199._0_4_ = fVar237 * 0.0 + fVar203 * 0.0 + fVar172;
          auVar199._4_4_ = fVar239 * 0.0 + fVar204 * 0.0 + fVar173;
          auVar199._8_4_ = fVar252 * 0.0 + fVar205 * 0.0 + fVar174;
          auVar199._12_4_ = fVar282 * 0.0 + fVar223 * 0.0 + fVar181;
          auVar74 = rcpps(_local_468,auVar199);
          fVar108 = auVar74._0_4_;
          fVar110 = auVar74._4_4_;
          fVar141 = auVar74._8_4_;
          fVar154 = auVar74._12_4_;
          fVar108 = (1.0 - auVar199._0_4_ * fVar108) * fVar108 + fVar108;
          fVar110 = (1.0 - auVar199._4_4_ * fVar110) * fVar110 + fVar110;
          fVar141 = (1.0 - auVar199._8_4_ * fVar141) * fVar141 + fVar141;
          fVar154 = (1.0 - auVar199._12_4_ * fVar154) * fVar154 + fVar154;
          fVar155 = (fVar155 * fVar172 + (float)local_268._0_4_ * fVar203 + local_3b8 * fVar237) *
                    fVar108;
          fVar109 = (fVar109 * fVar173 + (float)local_268._4_4_ * fVar204 + fStack_3b4 * fVar239) *
                    fVar110;
          fVar139 = (fVar139 * fVar174 + fStack_260 * fVar205 + fStack_3b0 * fVar252) * fVar141;
          fVar144 = (fVar144 * fVar181 + fStack_25c * fVar223 + fStack_3ac * fVar282) * fVar154;
          bVar27 = (fVar155 <= fVar182 && fStack_1bc <= fVar155) && bVar27;
          auVar99._0_4_ = -(uint)bVar27;
          bVar51 = (fVar109 <= fVar182 && fStack_1bc <= fVar109) && bVar51;
          auVar99._4_4_ = -(uint)bVar51;
          bVar26 = (fVar139 <= fVar182 && fStack_1bc <= fVar139) && bVar26;
          auVar99._8_4_ = -(uint)bVar26;
          bVar25 = (fVar144 <= fVar182 && fStack_1bc <= fVar144) && bVar25;
          auVar99._12_4_ = -(uint)bVar25;
          iVar52 = movmskps(iVar52,auVar99);
          if (iVar52 == 0) goto LAB_00b244fb;
          auVar100._0_8_ =
               CONCAT44(-(uint)(auVar199._4_4_ != 0.0 && bVar51),
                        -(uint)(auVar199._0_4_ != 0.0 && bVar27));
          auVar100._8_4_ = -(uint)(auVar199._8_4_ != 0.0 && bVar26);
          auVar100._12_4_ = -(uint)(auVar199._12_4_ != 0.0 && bVar25);
          iVar52 = movmskps(iVar52,auVar100);
          auVar165._8_8_ = uStack_2a0;
          auVar165._0_8_ = local_2a8;
          if (iVar52 != 0) {
            fVar271 = fVar271 * fVar108;
            fVar273 = fVar273 * fVar110;
            fVar278 = fVar278 * fVar141;
            fVar280 = fVar280 * fVar154;
            local_328 = (float)((uint)(1.0 - fVar271) & uVar66 | ~uVar66 & (uint)fVar271);
            fStack_324 = (float)((uint)(1.0 - fVar273) & uVar67 | ~uVar67 & (uint)fVar273);
            fStack_320 = (float)((uint)(1.0 - fVar278) & uVar68 | ~uVar68 & (uint)fVar278);
            fStack_31c = (float)((uint)(1.0 - fVar280) & uVar69 | ~uVar69 & (uint)fVar280);
            auVar165._8_4_ = auVar100._8_4_;
            auVar165._0_8_ = auVar100._0_8_;
            auVar165._12_4_ = auVar100._12_4_;
            local_1a8 = (float)(~uVar66 & (uint)(auVar286._0_4_ * fVar108) |
                               (uint)(1.0 - auVar286._0_4_ * fVar108) & uVar66);
            fStack_1a4 = (float)(~uVar67 & (uint)(auVar286._4_4_ * fVar110) |
                                (uint)(1.0 - auVar286._4_4_ * fVar110) & uVar67);
            fStack_1a0 = (float)(~uVar68 & (uint)(auVar286._8_4_ * fVar141) |
                                (uint)(1.0 - auVar286._8_4_ * fVar141) & uVar68);
            fStack_19c = (float)(~uVar69 & (uint)(auVar286._12_4_ * fVar154) |
                                (uint)(1.0 - auVar286._12_4_ * fVar154) & uVar69);
            fVar209 = fVar155;
            fVar210 = fVar109;
            fVar211 = fVar139;
            fVar219 = fVar144;
          }
        }
        iVar52 = movmskps(iVar52,auVar165);
        if (iVar52 != 0) {
          fVar108 = (auVar247._0_4_ - local_238._0_4_) * local_328 + local_238._0_4_;
          fVar109 = (auVar247._4_4_ - local_238._4_4_) * fStack_324 + local_238._4_4_;
          fVar110 = (auVar247._8_4_ - local_238._8_4_) * fStack_320 + local_238._8_4_;
          fVar139 = (auVar247._12_4_ - local_238._12_4_) * fStack_31c + local_238._12_4_;
          fVar155 = local_2f0->depth_scale;
          auVar101._0_4_ = -(uint)(fVar155 * (fVar108 + fVar108) < fVar209) & auVar165._0_4_;
          auVar101._4_4_ = -(uint)(fVar155 * (fVar109 + fVar109) < fVar210) & auVar165._4_4_;
          auVar101._8_4_ = -(uint)(fVar155 * (fVar110 + fVar110) < fVar211) & auVar165._8_4_;
          auVar101._12_4_ = -(uint)(fVar155 * (fVar139 + fVar139) < fVar219) & auVar165._12_4_;
          iVar52 = movmskps((int)local_2f0,auVar101);
          fVar155 = local_328;
          fVar108 = fStack_324;
          fVar109 = fStack_320;
          fVar110 = fStack_31c;
          if (iVar52 != 0) {
            local_1a8 = local_1a8 + local_1a8 + -1.0;
            fStack_1a4 = fStack_1a4 + fStack_1a4 + -1.0;
            fStack_1a0 = fStack_1a0 + fStack_1a0 + -1.0;
            fStack_19c = fStack_19c + fStack_19c + -1.0;
            local_158 = local_328;
            fStack_154 = fStack_324;
            fStack_150 = fStack_320;
            fStack_14c = fStack_31c;
            local_148 = local_1a8;
            fStack_144 = fStack_1a4;
            fStack_140 = fStack_1a0;
            fStack_13c = fStack_19c;
            local_138 = fVar209;
            fStack_134 = fVar210;
            fStack_130 = fVar211;
            fStack_12c = fVar219;
            local_128 = 0;
            local_124 = iVar19;
            local_118 = CONCAT44(fStack_314,local_318);
            uStack_110 = CONCAT44(fStack_30c,fStack_310);
            local_108 = CONCAT44(fStack_284,local_288);
            uStack_100 = CONCAT44(fStack_27c,fStack_280);
            local_f8 = CONCAT44(fStack_294,local_298);
            uStack_f0 = CONCAT44(fStack_28c,fStack_290);
            local_e8 = CONCAT44(fStack_274,local_278);
            uStack_e0 = CONCAT44(fStack_26c,fStack_270);
            local_d8 = auVar101;
            uVar66 = (ray->super_RayK<1>).mask;
            if ((pGVar20->mask & uVar66) != 0) {
              local_308 = auVar101;
              fVar72 = 1.0 / fVar72;
              local_c8[0] = fVar72 * (local_328 + 0.0);
              local_c8[1] = fVar72 * (fStack_324 + 1.0);
              local_c8[2] = fVar72 * (fStack_320 + 2.0);
              local_c8[3] = fVar72 * (fStack_31c + 3.0);
              local_b8 = CONCAT44(fStack_1a4,local_1a8);
              uStack_b0 = CONCAT44(fStack_19c,fStack_1a0);
              local_a8[0] = fVar209;
              local_a8[1] = fVar210;
              local_a8[2] = fVar211;
              local_a8[3] = fVar219;
              auVar126._0_4_ = auVar101._0_4_ & (uint)fVar209;
              auVar126._4_4_ = auVar101._4_4_ & (uint)fVar210;
              auVar126._8_4_ = auVar101._8_4_ & (uint)fVar211;
              auVar126._12_4_ = auVar101._12_4_ & (uint)fVar219;
              auVar147._0_8_ = CONCAT44(~auVar101._4_4_,~auVar101._0_4_) & 0x7f8000007f800000;
              auVar147._8_4_ = ~auVar101._8_4_ & 0x7f800000;
              auVar147._12_4_ = ~auVar101._12_4_ & 0x7f800000;
              auVar147 = auVar147 | auVar126;
              auVar166._4_4_ = auVar147._0_4_;
              auVar166._0_4_ = auVar147._4_4_;
              auVar166._8_4_ = auVar147._12_4_;
              auVar166._12_4_ = auVar147._8_4_;
              auVar74 = minps(auVar166,auVar147);
              auVar127._0_8_ = auVar74._8_8_;
              auVar127._8_4_ = auVar74._0_4_;
              auVar127._12_4_ = auVar74._4_4_;
              auVar74 = minps(auVar127,auVar74);
              auVar128._0_8_ =
                   CONCAT44(-(uint)(auVar74._4_4_ == auVar147._4_4_) & auVar101._4_4_,
                            -(uint)(auVar74._0_4_ == auVar147._0_4_) & auVar101._0_4_);
              auVar128._8_4_ = -(uint)(auVar74._8_4_ == auVar147._8_4_) & auVar101._8_4_;
              auVar128._12_4_ = -(uint)(auVar74._12_4_ == auVar147._12_4_) & auVar101._12_4_;
              iVar52 = movmskps(uVar66,auVar128);
              if (iVar52 != 0) {
                auVar101._8_4_ = auVar128._8_4_;
                auVar101._0_8_ = auVar128._0_8_;
                auVar101._12_4_ = auVar128._12_4_;
              }
              uVar66 = movmskps(iVar52,auVar101);
              lVar64 = 0;
              if (uVar66 != 0) {
                for (; (uVar66 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                }
              }
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar72 = local_c8[lVar64];
                fVar139 = *(float *)((long)&local_b8 + lVar64 * 4);
                fVar141 = 1.0 - fVar72;
                fVar154 = fVar72 * fVar141 + fVar72 * fVar141;
                fVar144 = fVar141 * fVar141 * -3.0;
                fVar172 = (fVar141 * fVar141 - fVar154) * 3.0;
                fVar141 = (fVar154 - fVar72 * fVar72) * 3.0;
                fVar154 = fVar72 * fVar72 * 3.0;
                (ray->super_RayK<1>).tfar = local_a8[lVar64];
                *(ulong *)&(ray->Ng).field_0 =
                     CONCAT44(fVar144 * fStack_314 +
                              fVar172 * fStack_284 + fVar141 * fStack_294 + fVar154 * fStack_274,
                              fVar144 * local_318 +
                              fVar172 * local_288 + fVar141 * local_298 + fVar154 * local_278);
                (ray->Ng).field_0.field_0.z =
                     fVar144 * fStack_310 +
                     fVar172 * fStack_280 + fVar141 * fStack_290 + fVar154 * fStack_270;
                ray->u = fVar72;
                ray->v = fVar139;
                ray->primID = (uint)local_3a0;
                ray->geomID = (uint)local_3d0;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                pRVar60 = (RTCIntersectArguments *)context;
              }
              else {
                _local_468 = ZEXT416((uint)(ray->super_RayK<1>).tfar);
                local_338 = fVar209;
                fStack_334 = fVar210;
                fStack_330 = fVar211;
                fStack_32c = fVar219;
LAB_00b254f9:
                local_1fc = local_c8[lVar64];
                local_1f8 = *(undefined4 *)((long)&local_b8 + lVar64 * 4);
                (ray->super_RayK<1>).tfar = local_a8[lVar64];
                local_2e8.context = context->user;
                fVar72 = 1.0 - local_1fc;
                fVar141 = local_1fc * fVar72 + local_1fc * fVar72;
                fVar139 = fVar72 * fVar72 * -3.0;
                fVar144 = (fVar72 * fVar72 - fVar141) * 3.0;
                fVar72 = (fVar141 - local_1fc * local_1fc) * 3.0;
                fVar141 = local_1fc * local_1fc * 3.0;
                local_208 = CONCAT44(fVar139 * fStack_314 +
                                     fVar144 * fStack_284 +
                                     fVar72 * fStack_294 + fVar141 * fStack_274,
                                     fVar139 * local_318 +
                                     fVar144 * local_288 + fVar72 * local_298 + fVar141 * local_278)
                ;
                local_200 = fVar139 * fStack_310 +
                            fVar144 * fStack_280 + fVar72 * fStack_290 + fVar141 * fStack_270;
                local_1f4 = (int)local_3a0;
                local_1f0 = (int)local_3d0;
                local_1ec = (local_2e8.context)->instID[0];
                local_1e8 = (local_2e8.context)->instPrimID[0];
                local_43c._0_4_ = -NAN;
                local_2e8.valid = (int *)local_43c;
                pRVar60 = (RTCIntersectArguments *)pGVar20->userPtr;
                local_2e8.geometryUserPtr = pRVar60;
                local_2e8.ray = (RTCRayN *)ray;
                local_2e8.hit = (RTCHitN *)&local_208;
                local_2e8.N = 1;
                if ((pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                   ((*pGVar20->intersectionFilterN)(&local_2e8), uVar61 = extraout_RDX_01,
                   fVar209 = local_338, fVar210 = fStack_334, fVar211 = fStack_330,
                   fVar219 = fStack_32c, fVar155 = local_328, fVar108 = fStack_324,
                   fVar109 = fStack_320, fVar110 = fStack_31c, fVar156 = local_3c8,
                   fVar224 = fStack_3c4, fVar229 = fStack_3c0, fVar231 = fStack_3bc,
                   uVar288 = aStack_40c.field_0.y, uVar230 = aStack_40c.field_0.z,
                   fVar272 = fStack_400, fVar221 = fStack_3fc,
                   (((RayK<1> *)local_2e8.valid)->org).field_0.m128[0] != 0.0)) {
                  pRVar60 = context->args;
                  if (((RTCIntersectArguments *)pRVar60->filter != (RTCIntersectArguments *)0x0) &&
                     (((((ulong)*(Scene **)&pRVar60->flags & 2) != 0 ||
                       (((pGVar20->field_8).field_0x2 & 0x40) != 0)) &&
                      ((*(code *)pRVar60->filter)(&local_2e8), uVar61 = extraout_RDX_02,
                      fVar209 = local_338, fVar210 = fStack_334, fVar211 = fStack_330,
                      fVar219 = fStack_32c, fVar155 = local_328, fVar108 = fStack_324,
                      fVar109 = fStack_320, fVar110 = fStack_31c, fVar156 = local_3c8,
                      fVar224 = fStack_3c4, fVar229 = fStack_3c0, fVar231 = fStack_3bc,
                      uVar288 = aStack_40c.field_0.y, uVar230 = aStack_40c.field_0.z,
                      fVar272 = fStack_400, fVar221 = fStack_3fc,
                      (((RayK<1> *)local_2e8.valid)->org).field_0.m128[0] == 0.0))))
                  goto LAB_00b25767;
                  (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_2e8.hit;
                  (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_2e8.hit + 4);
                  (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_2e8.hit + 8);
                  *(float *)((long)local_2e8.ray + 0x3c) = *(float *)(local_2e8.hit + 0xc);
                  *(float *)((long)local_2e8.ray + 0x40) = *(float *)(local_2e8.hit + 0x10);
                  *(float *)((long)local_2e8.ray + 0x44) = *(float *)(local_2e8.hit + 0x14);
                  *(float *)((long)local_2e8.ray + 0x48) = *(float *)(local_2e8.hit + 0x18);
                  uVar61 = (ulong)(uint)*(float *)(local_2e8.hit + 0x1c);
                  *(float *)((long)local_2e8.ray + 0x4c) = *(float *)(local_2e8.hit + 0x1c);
                  pRVar60 = (RTCIntersectArguments *)(ulong)(uint)*(float *)(local_2e8.hit + 0x20);
                  *(float *)((long)local_2e8.ray + 0x50) = *(float *)(local_2e8.hit + 0x20);
                  pRVar56 = (RayHit *)local_2e8.ray;
                }
                else {
LAB_00b25767:
                  (ray->super_RayK<1>).tfar = (float)local_468._0_4_;
                  pRVar56 = (RayHit *)local_2e8.valid;
                  fVar209 = local_338;
                  fVar210 = fStack_334;
                  fVar211 = fStack_330;
                  fVar219 = fStack_32c;
                  fVar155 = local_328;
                  fVar108 = fStack_324;
                  fVar109 = fStack_320;
                  fVar110 = fStack_31c;
                  fVar156 = local_3c8;
                  fVar224 = fStack_3c4;
                  fVar229 = fStack_3c0;
                  fVar231 = fStack_3bc;
                  uVar288 = aStack_40c.field_0.y;
                  uVar230 = aStack_40c.field_0.z;
                  fVar272 = fStack_400;
                  fVar221 = fStack_3fc;
                }
                *(undefined4 *)(local_308 + lVar64 * 4) = 0;
                fVar72 = (ray->super_RayK<1>).tfar;
                local_468._0_4_ = (ray->super_RayK<1>).tfar;
                local_468._4_4_ = (ray->super_RayK<1>).mask;
                fStack_460 = (float)(ray->super_RayK<1>).id;
                fStack_45c = (float)(ray->super_RayK<1>).flags;
                auVar105._0_4_ = -(uint)(fVar209 <= fVar72) & local_308._0_4_;
                auVar105._4_4_ = -(uint)(fVar210 <= fVar72) & local_308._4_4_;
                auVar105._8_4_ = -(uint)(fVar211 <= fVar72) & local_308._8_4_;
                auVar105._12_4_ = -(uint)(fVar219 <= fVar72) & local_308._12_4_;
                local_308 = auVar105;
                iVar52 = movmskps((int)pRVar56,auVar105);
                if (iVar52 != 0) {
                  auVar136._0_4_ = auVar105._0_4_ & (uint)fVar209;
                  auVar136._4_4_ = auVar105._4_4_ & (uint)fVar210;
                  auVar136._8_4_ = auVar105._8_4_ & (uint)fVar211;
                  auVar136._12_4_ = auVar105._12_4_ & (uint)fVar219;
                  auVar153._0_8_ = CONCAT44(~auVar105._4_4_,~auVar105._0_4_) & 0x7f8000007f800000;
                  auVar153._8_4_ = ~auVar105._8_4_ & 0x7f800000;
                  auVar153._12_4_ = ~auVar105._12_4_ & 0x7f800000;
                  auVar153 = auVar153 | auVar136;
                  auVar171._4_4_ = auVar153._0_4_;
                  auVar171._0_4_ = auVar153._4_4_;
                  auVar171._8_4_ = auVar153._12_4_;
                  auVar171._12_4_ = auVar153._8_4_;
                  auVar74 = minps(auVar171,auVar153);
                  auVar137._0_8_ = auVar74._8_8_;
                  auVar137._8_4_ = auVar74._0_4_;
                  auVar137._12_4_ = auVar74._4_4_;
                  auVar74 = minps(auVar137,auVar74);
                  auVar138._0_8_ =
                       CONCAT44(-(uint)(auVar74._4_4_ == auVar153._4_4_) & auVar105._4_4_,
                                -(uint)(auVar74._0_4_ == auVar153._0_4_) & auVar105._0_4_);
                  auVar138._8_4_ = -(uint)(auVar74._8_4_ == auVar153._8_4_) & auVar105._8_4_;
                  auVar138._12_4_ = -(uint)(auVar74._12_4_ == auVar153._12_4_) & auVar105._12_4_;
                  iVar52 = movmskps(iVar52,auVar138);
                  if (iVar52 != 0) {
                    auVar105._8_4_ = auVar138._8_4_;
                    auVar105._0_8_ = auVar138._0_8_;
                    auVar105._12_4_ = auVar138._12_4_;
                  }
                  uVar53 = movmskps(iVar52,auVar105);
                  uVar57 = CONCAT44((int)((ulong)pRVar56 >> 0x20),uVar53);
                  lVar64 = 0;
                  if (uVar57 != 0) {
                    for (; (uVar57 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                    }
                  }
                  goto LAB_00b254f9;
                }
              }
              iVar58 = (int)pRVar60;
              prim = local_2f8;
            }
          }
          local_328 = fVar155;
          fStack_324 = fVar108;
          fStack_320 = fVar109;
          fStack_31c = fVar110;
          fVar220 = local_3f8;
        }
      }
      local_338 = fVar209;
      fStack_334 = fVar210;
      fStack_330 = fVar211;
      fStack_32c = fVar219;
      if (4 < iVar19) {
        local_68 = iVar19;
        iStack_64 = iVar19;
        iStack_60 = iVar19;
        iStack_5c = iVar19;
        local_1c8 = fStack_1bc;
        fStack_1c4 = fStack_1bc;
        fStack_1c0 = fStack_1bc;
        local_78 = 1.0 / (float)local_1d8._0_4_;
        fStack_74 = local_78;
        fStack_70 = local_78;
        fStack_6c = local_78;
        lVar64 = 4;
        fStack_3f4 = fVar220;
        local_3f8 = fVar220;
        auStack_3f0[0] = (uint)fVar220;
        auStack_3ec[0] = (uint)fVar220;
        do {
          uVar67 = (uint)lVar64;
          bVar25 = (int)(uVar67 | 1) < iStack_64;
          bVar26 = (int)(uVar67 | 2) < iStack_60;
          uStack_430 = -(uint)bVar26;
          bVar27 = (int)(uVar67 | 3) < iStack_5c;
          aStack_42c.m128[0] = (float)-(uint)bVar27;
          fStack_434 = (float)-(uint)bVar25;
          local_43c._4_4_ = -(uint)((int)uVar67 < local_68);
          pRVar60 = (RTCIntersectArguments *)(bezier_basis0 + lVar24);
          pauVar8 = (undefined1 (*) [16])((long)&pRVar60->flags + lVar64 * 4);
          fVar155 = *(float *)*pauVar8;
          fVar72 = *(float *)(*pauVar8 + 4);
          fVar108 = *(float *)(*pauVar8 + 8);
          auVar31 = *(undefined1 (*) [12])*pauVar8;
          fVar109 = *(float *)(*pauVar8 + 0xc);
          _local_248 = *pauVar8;
          pauVar8 = (undefined1 (*) [16])(lVar24 + 0x21aa768 + lVar64 * 4);
          fVar110 = *(float *)*pauVar8;
          fVar139 = *(float *)(*pauVar8 + 4);
          fVar141 = *(float *)(*pauVar8 + 8);
          auVar30 = *(undefined1 (*) [12])*pauVar8;
          fVar144 = *(float *)(*pauVar8 + 0xc);
          _local_348 = *pauVar8;
          pfVar1 = (float *)(lVar24 + 0x21aabec + lVar64 * 4);
          local_358 = *pfVar1;
          fStack_354 = pfVar1[1];
          fStack_350 = pfVar1[2];
          fStack_34c = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x21ab070 + lVar64 * 4);
          local_3b8 = *pfVar1;
          fStack_3b4 = pfVar1[1];
          fStack_3b0 = pfVar1[2];
          fStack_3ac = pfVar1[3];
          local_398._0_4_ =
               local_178 * fVar155 +
               fVar180 * fVar110 + local_388 * local_358 + local_418 * local_3b8;
          local_398._4_4_ =
               fStack_174 * fVar72 +
               fVar180 * fVar139 + fStack_384 * fStack_354 + fStack_414 * fStack_3b4;
          fStack_390 = fStack_170 * fVar108 +
                       fVar180 * fVar141 + fStack_380 * fStack_350 + fStack_410 * fStack_3b0;
          fStack_38c = fStack_16c * fVar109 +
                       fVar180 * fVar144 +
                       fStack_37c * fStack_34c + aStack_40c.field_0.x * fStack_3ac;
          local_198 = local_188 * fVar155 +
                      aStack_42c.m128[1] * fVar110 +
                      fVar156 * local_358 + (float)uVar288 * local_3b8;
          fStack_194 = fStack_184 * fVar72 +
                       aStack_42c.m128[2] * fVar139 +
                       fVar224 * fStack_354 + (float)uVar230 * fStack_3b4;
          fStack_190 = fStack_180 * fVar108 +
                       aStack_42c.m128[3] * fVar141 + fVar229 * fStack_350 + fVar272 * fStack_3b0;
          fStack_18c = fStack_17c * fVar109 +
                       fStack_41c * fVar144 + fVar231 * fStack_34c + fVar221 * fStack_3ac;
          local_268._0_4_ =
               local_98 * fVar155 +
               local_88 * fVar110 + local_168 * local_358 + local_58 * local_3b8;
          local_268._4_4_ =
               fStack_94 * fVar72 +
               fStack_84 * fVar139 + fStack_164 * fStack_354 + fStack_54 * fStack_3b4;
          fStack_260 = fStack_90 * fVar108 +
                       fStack_80 * fVar141 + fStack_160 * fStack_350 + fStack_50 * fStack_3b0;
          fStack_25c = fStack_8c * fVar109 +
                       fStack_7c * fVar144 + fStack_15c * fStack_34c + fStack_4c * fStack_3ac;
          pfVar1 = (float *)(bezier_basis1 + lVar24 + lVar64 * 4);
          fVar155 = *pfVar1;
          fVar72 = pfVar1[1];
          fVar108 = pfVar1[2];
          fVar110 = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x21acb88 + lVar64 * 4);
          fVar139 = *pfVar1;
          fVar141 = pfVar1[1];
          fVar154 = pfVar1[2];
          fVar172 = pfVar1[3];
          pfVar1 = (float *)(lVar24 + 0x21ad00c + lVar64 * 4);
          fVar173 = *pfVar1;
          fVar174 = pfVar1[1];
          fVar181 = pfVar1[2];
          fVar182 = pfVar1[3];
          pauVar9 = (undefined1 (*) [12])(lVar24 + 0x21ad490 + lVar64 * 4);
          fVar203 = *(float *)*pauVar9;
          fVar204 = *(float *)(*pauVar9 + 4);
          fVar205 = *(float *)(*pauVar9 + 8);
          auVar32 = *pauVar9;
          fVar209 = *(float *)pauVar9[1];
          fVar237 = local_178 * fVar155 +
                    fVar180 * fVar139 + local_388 * fVar173 + local_418 * fVar203;
          fVar238 = fStack_174 * fVar72 +
                    fVar180 * fVar141 + fStack_384 * fVar174 + fStack_414 * fVar204;
          fVar239 = fStack_170 * fVar108 +
                    fVar180 * fVar154 + fStack_380 * fVar181 + fStack_410 * fVar205;
          fVar249 = fStack_16c * fVar110 +
                    fVar180 * fVar172 + fStack_37c * fVar182 + aStack_40c.field_0.x * fVar209;
          fVar222 = local_188 * fVar155 +
                    aStack_42c.m128[1] * fVar139 + fVar156 * fVar173 + (float)uVar288 * fVar203;
          fVar223 = fStack_184 * fVar72 +
                    aStack_42c.m128[2] * fVar141 + fVar224 * fVar174 + (float)uVar230 * fVar204;
          fVar232 = fStack_180 * fVar108 +
                    aStack_42c.m128[3] * fVar154 + fVar229 * fVar181 + fVar272 * fVar205;
          fVar221 = fStack_17c * fVar110 +
                    fStack_41c * fVar172 + fVar231 * fVar182 + fVar221 * fVar209;
          auVar267._0_4_ =
               local_98 * fVar155 + local_88 * fVar139 + local_168 * fVar173 + local_58 * fVar203;
          auVar267._4_4_ =
               fStack_94 * fVar72 + fStack_84 * fVar141 + fStack_164 * fVar174 + fStack_54 * fVar204
          ;
          auVar267._8_4_ =
               fStack_90 * fVar108 +
               fStack_80 * fVar154 + fStack_160 * fVar181 + fStack_50 * fVar205;
          auVar267._12_4_ =
               fStack_8c * fVar110 +
               fStack_7c * fVar172 + fStack_15c * fVar182 + fStack_4c * fVar209;
          fVar224 = fVar237 - (float)local_398._0_4_;
          fVar229 = fVar238 - (float)local_398._4_4_;
          fVar231 = fVar239 - fStack_390;
          fVar272 = fVar249 - fStack_38c;
          fVar210 = fVar222 - local_198;
          fVar211 = fVar223 - fStack_194;
          fVar219 = fVar232 - fStack_190;
          fVar220 = fVar221 - fStack_18c;
          fVar156 = local_198 * fVar224 - (float)local_398._0_4_ * fVar210;
          fVar203 = fStack_194 * fVar229 - (float)local_398._4_4_ * fVar211;
          fVar204 = fStack_190 * fVar231 - fStack_390 * fVar219;
          fVar205 = fStack_18c * fVar272 - fStack_38c * fVar220;
          auVar74 = maxps(_local_268,auVar267);
          bVar51 = fVar156 * fVar156 <=
                   auVar74._0_4_ * auVar74._0_4_ * (fVar224 * fVar224 + fVar210 * fVar210) &&
                   (int)uVar67 < local_68;
          auVar218._0_4_ = -(uint)bVar51;
          bVar25 = fVar203 * fVar203 <=
                   auVar74._4_4_ * auVar74._4_4_ * (fVar229 * fVar229 + fVar211 * fVar211) && bVar25
          ;
          auVar218._4_4_ = -(uint)bVar25;
          bVar26 = fVar204 * fVar204 <=
                   auVar74._8_4_ * auVar74._8_4_ * (fVar231 * fVar231 + fVar219 * fVar219) && bVar26
          ;
          auVar218._8_4_ = -(uint)bVar26;
          bVar27 = fVar205 * fVar205 <=
                   auVar74._12_4_ * auVar74._12_4_ * (fVar272 * fVar272 + fVar220 * fVar220) &&
                   bVar27;
          auVar218._12_4_ = -(uint)bVar27;
          uVar66 = movmskps((int)uVar61,auVar218);
          uVar61 = (ulong)uVar66;
          fVar156 = local_378;
          fVar203 = fStack_374;
          fVar204 = fStack_370;
          fVar205 = fStack_36c;
          if (uVar66 != 0) {
            local_368 = fVar210;
            fStack_364 = fVar211;
            fStack_360 = fVar219;
            fStack_35c = fVar220;
            local_238 = auVar267;
            local_1d8._4_4_ = fVar229;
            local_1d8._0_4_ = fVar224;
            fStack_1d0 = fVar231;
            fStack_1cc = fVar272;
            local_468._0_4_ = auVar32._0_4_;
            local_468._4_4_ = auVar32._4_4_;
            fStack_460 = auVar32._8_4_;
            fVar256 = (float)local_468._0_4_ * local_228 + fVar173 * local_218 + fVar139 * local_258
                      + fVar155 * (float)local_3e8._0_4_;
            fVar284 = (float)local_468._4_4_ * fStack_224 + fVar174 * fStack_214 +
                      fVar141 * fStack_254 + fVar72 * (float)local_3e8._4_4_;
            fVar289 = fStack_460 * fStack_220 + fVar181 * fStack_210 + fVar154 * fStack_250 +
                      fVar108 * fStack_3e0;
            fVar291 = fVar209 * fStack_21c + fVar182 * fStack_20c + fVar172 * fStack_24c +
                      fVar110 * fStack_3dc;
            local_248._0_4_ = auVar31._0_4_;
            local_248._4_4_ = auVar31._4_4_;
            fStack_240 = auVar31._8_4_;
            fVar111 = (float)local_248._0_4_ * (float)local_3e8._0_4_;
            fVar140 = (float)local_248._4_4_ * (float)local_3e8._4_4_;
            fVar142 = fStack_240 * fStack_3e0;
            local_348._0_4_ = auVar30._0_4_;
            local_348._4_4_ = auVar30._4_4_;
            fStack_340 = auVar30._8_4_;
            _local_248 = auVar218;
            fVar111 = local_3b8 * local_228 + local_358 * local_218 +
                      (float)local_348._0_4_ * local_258 + fVar111;
            fVar140 = fStack_3b4 * fStack_224 + fStack_354 * fStack_214 +
                      (float)local_348._4_4_ * fStack_254 + fVar140;
            fVar142 = fStack_3b0 * fStack_220 + fStack_350 * fStack_210 + fStack_340 * fStack_250 +
                      fVar142;
            fVar293 = fStack_3ac * fStack_21c + fStack_34c * fStack_20c + fVar144 * fStack_24c +
                      fVar109 * fStack_3dc;
            pfVar1 = (float *)(lVar24 + 0x21ab4f4 + lVar64 * 4);
            fVar155 = *pfVar1;
            fVar72 = pfVar1[1];
            fVar108 = pfVar1[2];
            fVar109 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21ab978 + lVar64 * 4);
            fVar110 = *pfVar1;
            fVar139 = pfVar1[1];
            fVar141 = pfVar1[2];
            fVar144 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21abdfc + lVar64 * 4);
            fVar154 = *pfVar1;
            fVar172 = pfVar1[1];
            fVar173 = pfVar1[2];
            fVar174 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21ac280 + lVar64 * 4);
            fVar181 = *pfVar1;
            fVar182 = pfVar1[1];
            fVar209 = pfVar1[2];
            fVar252 = pfVar1[3];
            fVar241 = local_178 * fVar155 +
                      fVar180 * fVar110 + local_388 * fVar154 + local_418 * fVar181;
            fVar251 = fStack_174 * fVar72 +
                      fVar180 * fVar139 + fStack_384 * fVar172 + fStack_414 * fVar182;
            fVar254 = fStack_170 * fVar108 +
                      fVar180 * fVar141 + fStack_380 * fVar173 + fStack_410 * fVar209;
            fVar257 = fStack_16c * fVar109 +
                      fVar180 * fVar144 + fStack_37c * fVar174 + aStack_40c.field_0.x * fVar252;
            fVar143 = local_188 * fVar155 +
                      aStack_42c.m128[1] * fVar110 +
                      local_3c8 * fVar154 + aStack_40c.field_0.y * fVar181;
            fVar240 = fStack_184 * fVar72 +
                      aStack_42c.m128[2] * fVar139 +
                      fStack_3c4 * fVar172 + aStack_40c.field_0.z * fVar182;
            fVar250 = fStack_180 * fVar108 +
                      aStack_42c.m128[3] * fVar141 + fStack_3c0 * fVar173 + fStack_400 * fVar209;
            fVar253 = fStack_17c * fVar109 +
                      fStack_41c * fVar144 + fStack_3bc * fVar174 + fStack_3fc * fVar252;
            pfVar1 = (float *)(lVar24 + 0x21ad914 + lVar64 * 4);
            fVar255 = *pfVar1;
            fVar258 = pfVar1[1];
            fVar269 = pfVar1[2];
            fVar270 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21ae21c + lVar64 * 4);
            fVar271 = *pfVar1;
            fVar273 = pfVar1[1];
            fVar278 = pfVar1[2];
            fVar280 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21ae6a0 + lVar64 * 4);
            fVar282 = *pfVar1;
            fVar279 = pfVar1[1];
            fVar281 = pfVar1[2];
            fVar283 = pfVar1[3];
            pfVar1 = (float *)(lVar24 + 0x21add98 + lVar64 * 4);
            fVar297 = *pfVar1;
            fVar299 = pfVar1[1];
            fVar301 = pfVar1[2];
            fVar296 = pfVar1[3];
            fVar285 = local_178 * fVar255 +
                      fVar180 * fVar297 + local_388 * fVar271 + local_418 * fVar282;
            fVar290 = fStack_174 * fVar258 +
                      fVar180 * fVar299 + fStack_384 * fVar273 + fStack_414 * fVar279;
            fVar292 = fStack_170 * fVar269 +
                      fVar180 * fVar301 + fStack_380 * fVar278 + fStack_410 * fVar281;
            fVar294 = fStack_16c * fVar270 +
                      fVar180 * fVar296 + fStack_37c * fVar280 + aStack_40c.field_0.x * fVar283;
            fVar295 = local_188 * fVar255 +
                      aStack_42c.m128[1] * fVar297 +
                      local_3c8 * fVar271 + aStack_40c.field_0.y * fVar282;
            fVar298 = fStack_184 * fVar258 +
                      aStack_42c.m128[2] * fVar299 +
                      fStack_3c4 * fVar273 + aStack_40c.field_0.z * fVar279;
            fVar300 = fStack_180 * fVar269 +
                      aStack_42c.m128[3] * fVar301 + fStack_3c0 * fVar278 + fStack_400 * fVar281;
            fVar302 = fStack_17c * fVar270 +
                      fStack_41c * fVar296 + fStack_3bc * fVar280 + fStack_3fc * fVar283;
            auVar268._0_8_ = CONCAT44(fVar251,fVar241) & 0x7fffffff7fffffff;
            auVar268._8_4_ = ABS(fVar254);
            auVar268._12_4_ = ABS(fVar257);
            auVar200._0_8_ = CONCAT44(fVar240,fVar143) & 0x7fffffff7fffffff;
            auVar200._8_4_ = ABS(fVar250);
            auVar200._12_4_ = ABS(fVar253);
            auVar74 = maxps(auVar268,auVar200);
            auVar276._0_8_ =
                 CONCAT44(fVar72 * (float)local_3e8._4_4_ +
                          fVar139 * fStack_254 + fVar172 * fStack_214 + fVar182 * fStack_224,
                          fVar155 * (float)local_3e8._0_4_ +
                          fVar110 * local_258 + fVar154 * local_218 + fVar181 * local_228) &
                 0x7fffffff7fffffff;
            auVar276._8_4_ =
                 ABS(fVar108 * fStack_3e0 +
                     fVar141 * fStack_250 + fVar173 * fStack_210 + fVar209 * fStack_220);
            auVar276._12_4_ =
                 ABS(fVar109 * fStack_3dc +
                     fVar144 * fStack_24c + fVar174 * fStack_20c + fVar252 * fStack_21c);
            auVar74 = maxps(auVar74,auVar276);
            uVar66 = -(uint)(local_3f8 <= auVar74._0_4_);
            uVar68 = -(uint)(fStack_3f4 <= auVar74._4_4_);
            uVar69 = -(uint)((float)auStack_3f0[0] <= auVar74._8_4_);
            uVar70 = -(uint)((float)auStack_3ec[0] <= auVar74._12_4_);
            auVar201._0_4_ = ~uVar66 & (uint)fVar224;
            auVar201._4_4_ = ~uVar68 & (uint)fVar229;
            auVar201._8_4_ = ~uVar69 & (uint)fVar231;
            auVar201._12_4_ = ~uVar70 & (uint)fVar272;
            auVar248._0_4_ = (uint)fVar241 & uVar66;
            auVar248._4_4_ = (uint)fVar251 & uVar68;
            auVar248._8_4_ = (uint)fVar254 & uVar69;
            auVar248._12_4_ = (uint)fVar257 & uVar70;
            auVar248 = auVar248 | auVar201;
            fVar172 = (float)(~uVar66 & (uint)fVar210 | (uint)fVar143 & uVar66);
            fVar174 = (float)(~uVar68 & (uint)fVar211 | (uint)fVar240 & uVar68);
            fVar252 = (float)(~uVar69 & (uint)fVar219 | (uint)fVar250 & uVar69);
            fVar143 = (float)(~uVar70 & (uint)fVar220 | (uint)fVar253 & uVar70);
            auVar277._0_8_ = CONCAT44(fVar290,fVar285) & 0x7fffffff7fffffff;
            auVar277._8_4_ = ABS(fVar292);
            auVar277._12_4_ = ABS(fVar294);
            auVar148._0_8_ = CONCAT44(fVar298,fVar295) & 0x7fffffff7fffffff;
            auVar148._8_4_ = ABS(fVar300);
            auVar148._12_4_ = ABS(fVar302);
            auVar74 = maxps(auVar277,auVar148);
            auVar102._0_8_ =
                 CONCAT44(fVar258 * (float)local_3e8._4_4_ +
                          fVar299 * fStack_254 + fVar273 * fStack_214 + fVar279 * fStack_224,
                          fVar255 * (float)local_3e8._0_4_ +
                          fVar297 * local_258 + fVar271 * local_218 + fVar282 * local_228) &
                 0x7fffffff7fffffff;
            auVar102._8_4_ =
                 ABS(fVar269 * fStack_3e0 +
                     fVar301 * fStack_250 + fVar278 * fStack_210 + fVar281 * fStack_220);
            auVar102._12_4_ =
                 ABS(fVar270 * fStack_3dc +
                     fVar296 * fStack_24c + fVar280 * fStack_20c + fVar283 * fStack_21c);
            auVar74 = maxps(auVar74,auVar102);
            uVar66 = -(uint)(local_3f8 <= auVar74._0_4_);
            uVar68 = -(uint)(fStack_3f4 <= auVar74._4_4_);
            uVar69 = -(uint)((float)auStack_3f0[0] <= auVar74._8_4_);
            uVar70 = -(uint)((float)auStack_3ec[0] <= auVar74._12_4_);
            fVar255 = (float)((uint)fVar285 & uVar66 | ~uVar66 & (uint)fVar224);
            fVar229 = (float)((uint)fVar290 & uVar68 | ~uVar68 & (uint)fVar229);
            fVar271 = (float)((uint)fVar292 & uVar69 | ~uVar69 & (uint)fVar231);
            fVar272 = (float)((uint)fVar294 & uVar70 | ~uVar70 & (uint)fVar272);
            fVar224 = (float)(~uVar66 & (uint)fVar210 | (uint)fVar295 & uVar66);
            fVar211 = (float)(~uVar68 & (uint)fVar211 | (uint)fVar298 & uVar68);
            fVar219 = (float)(~uVar69 & (uint)fVar219 | (uint)fVar300 & uVar69);
            fVar220 = (float)(~uVar70 & (uint)fVar220 | (uint)fVar302 & uVar70);
            fVar144 = auVar248._0_4_;
            fVar155 = auVar248._4_4_;
            fVar72 = auVar248._8_4_;
            fVar108 = auVar248._12_4_;
            auVar176._0_4_ = fVar172 * fVar172 + fVar144 * fVar144;
            auVar176._4_4_ = fVar174 * fVar174 + fVar155 * fVar155;
            auVar176._8_4_ = fVar252 * fVar252 + fVar72 * fVar72;
            auVar176._12_4_ = fVar143 * fVar143 + fVar108 * fVar108;
            auVar74 = rsqrtps(auVar201,auVar176);
            fVar109 = auVar74._0_4_;
            fVar110 = auVar74._4_4_;
            fVar139 = auVar74._8_4_;
            fVar141 = auVar74._12_4_;
            auVar202._0_4_ = fVar109 * fVar109 * auVar176._0_4_ * 0.5 * fVar109;
            auVar202._4_4_ = fVar110 * fVar110 * auVar176._4_4_ * 0.5 * fVar110;
            auVar202._8_4_ = fVar139 * fVar139 * auVar176._8_4_ * 0.5 * fVar139;
            auVar202._12_4_ = fVar141 * fVar141 * auVar176._12_4_ * 0.5 * fVar141;
            fVar181 = fVar109 * 1.5 - auVar202._0_4_;
            fVar182 = fVar110 * 1.5 - auVar202._4_4_;
            fVar209 = fVar139 * 1.5 - auVar202._8_4_;
            fVar210 = fVar141 * 1.5 - auVar202._12_4_;
            auVar177._0_4_ = fVar224 * fVar224 + fVar255 * fVar255;
            auVar177._4_4_ = fVar211 * fVar211 + fVar229 * fVar229;
            auVar177._8_4_ = fVar219 * fVar219 + fVar271 * fVar271;
            auVar177._12_4_ = fVar220 * fVar220 + fVar272 * fVar272;
            auVar74 = rsqrtps(auVar202,auVar177);
            fVar109 = auVar74._0_4_;
            fVar110 = auVar74._4_4_;
            fVar139 = auVar74._8_4_;
            fVar141 = auVar74._12_4_;
            fVar154 = fVar109 * 1.5 - fVar109 * fVar109 * auVar177._0_4_ * 0.5 * fVar109;
            fVar110 = fVar110 * 1.5 - fVar110 * fVar110 * auVar177._4_4_ * 0.5 * fVar110;
            fVar173 = fVar139 * 1.5 - fVar139 * fVar139 * auVar177._8_4_ * 0.5 * fVar139;
            fVar141 = fVar141 * 1.5 - fVar141 * fVar141 * auVar177._12_4_ * 0.5 * fVar141;
            fVar282 = fVar172 * fVar181 * (float)local_268._0_4_;
            fVar281 = fVar174 * fVar182 * (float)local_268._4_4_;
            fVar297 = fVar252 * fVar209 * fStack_260;
            fVar301 = fVar143 * fVar210 * fStack_25c;
            fVar139 = -fVar144 * fVar181 * (float)local_268._0_4_;
            fVar144 = -fVar155 * fVar182 * (float)local_268._4_4_;
            fVar172 = -fVar72 * fVar209 * fStack_260;
            fVar174 = -fVar108 * fVar210 * fStack_25c;
            fVar231 = fVar181 * 0.0 * (float)local_268._0_4_;
            fVar258 = fVar182 * 0.0 * (float)local_268._4_4_;
            fVar269 = fVar209 * 0.0 * fStack_260;
            fVar270 = fVar210 * 0.0 * fStack_25c;
            local_348._0_4_ = fVar111 + fVar231;
            local_348._4_4_ = fVar140 + fVar258;
            fStack_340 = fVar142 + fVar269;
            fStack_33c = fVar293 + fVar270;
            fVar143 = fVar224 * fVar154 * auVar267._0_4_;
            fVar240 = fVar211 * fVar110 * auVar267._4_4_;
            fVar250 = fVar219 * fVar173 * auVar267._8_4_;
            fVar253 = fVar220 * fVar141 * auVar267._12_4_;
            fVar155 = fVar237 + fVar143;
            fVar72 = fVar238 + fVar240;
            fVar108 = fVar239 + fVar250;
            fVar109 = fVar249 + fVar253;
            fVar181 = -fVar255 * fVar154 * auVar267._0_4_;
            fVar182 = -fVar229 * fVar110 * auVar267._4_4_;
            fVar209 = -fVar271 * fVar173 * auVar267._8_4_;
            fVar210 = -fVar272 * fVar141 * auVar267._12_4_;
            fVar271 = fVar222 + fVar181;
            fVar273 = fVar223 + fVar182;
            fVar278 = fVar232 + fVar209;
            fVar280 = fVar221 + fVar210;
            fVar211 = fVar154 * 0.0 * auVar267._0_4_;
            fVar219 = fVar110 * 0.0 * auVar267._4_4_;
            fVar220 = fVar173 * 0.0 * auVar267._8_4_;
            fVar224 = fVar141 * 0.0 * auVar267._12_4_;
            fVar229 = (float)local_398._0_4_ - fVar282;
            fVar272 = (float)local_398._4_4_ - fVar281;
            fVar252 = fStack_390 - fVar297;
            fVar255 = fStack_38c - fVar301;
            fVar279 = fVar256 + fVar211;
            fVar283 = fVar284 + fVar219;
            fVar299 = fVar289 + fVar220;
            fVar296 = fVar291 + fVar224;
            fVar110 = local_198 - fVar139;
            fVar141 = fStack_194 - fVar144;
            fVar154 = fStack_190 - fVar172;
            fVar173 = fStack_18c - fVar174;
            fVar111 = fVar111 - fVar231;
            fVar140 = fVar140 - fVar258;
            fVar142 = fVar142 - fVar269;
            fVar293 = fVar293 - fVar270;
            uVar66 = -(uint)(0.0 < (fVar110 * (fVar279 - fVar111) - fVar111 * (fVar271 - fVar110)) *
                                   0.0 + (fVar111 * (fVar155 - fVar229) -
                                         (fVar279 - fVar111) * fVar229) * 0.0 +
                                         ((fVar271 - fVar110) * fVar229 -
                                         (fVar155 - fVar229) * fVar110));
            uVar68 = -(uint)(0.0 < (fVar141 * (fVar283 - fVar140) - fVar140 * (fVar273 - fVar141)) *
                                   0.0 + (fVar140 * (fVar72 - fVar272) -
                                         (fVar283 - fVar140) * fVar272) * 0.0 +
                                         ((fVar273 - fVar141) * fVar272 -
                                         (fVar72 - fVar272) * fVar141));
            uVar69 = -(uint)(0.0 < (fVar154 * (fVar299 - fVar142) - fVar142 * (fVar278 - fVar154)) *
                                   0.0 + (fVar142 * (fVar108 - fVar252) -
                                         (fVar299 - fVar142) * fVar252) * 0.0 +
                                         ((fVar278 - fVar154) * fVar252 -
                                         (fVar108 - fVar252) * fVar154));
            uVar70 = -(uint)(0.0 < (fVar173 * (fVar296 - fVar293) - fVar293 * (fVar280 - fVar173)) *
                                   0.0 + (fVar293 * (fVar109 - fVar255) -
                                         (fVar296 - fVar293) * fVar255) * 0.0 +
                                         ((fVar280 - fVar173) * fVar255 -
                                         (fVar109 - fVar255) * fVar173));
            local_3b8 = (float)((uint)(fVar237 - fVar143) & uVar66 |
                               ~uVar66 & (uint)((float)local_398._0_4_ + fVar282));
            fStack_3b4 = (float)((uint)(fVar238 - fVar240) & uVar68 |
                                ~uVar68 & (uint)((float)local_398._4_4_ + fVar281));
            fStack_3b0 = (float)((uint)(fVar239 - fVar250) & uVar69 |
                                ~uVar69 & (uint)(fStack_390 + fVar297));
            fStack_3ac = (float)((uint)(fVar249 - fVar253) & uVar70 |
                                ~uVar70 & (uint)(fStack_38c + fVar301));
            local_43c._4_4_ =
                 (uint)(fVar222 - fVar181) & uVar66 | ~uVar66 & (uint)(local_198 + fVar139);
            fStack_434 = (float)((uint)(fVar223 - fVar182) & uVar68 |
                                ~uVar68 & (uint)(fStack_194 + fVar144));
            uStack_430 = (uint)(fVar232 - fVar209) & uVar69 | ~uVar69 & (uint)(fStack_190 + fVar172)
            ;
            aStack_42c.m128[0] =
                 (float)((uint)(fVar221 - fVar210) & uVar70 | ~uVar70 & (uint)(fStack_18c + fVar174)
                        );
            fVar181 = (float)((uint)(fVar256 - fVar211) & uVar66 | ~uVar66 & local_348._0_4_);
            fVar182 = (float)((uint)(fVar284 - fVar219) & uVar68 | ~uVar68 & local_348._4_4_);
            fVar209 = (float)((uint)(fVar289 - fVar220) & uVar69 | ~uVar69 & (uint)fStack_340);
            fVar210 = (float)((uint)(fVar291 - fVar224) & uVar70 | ~uVar70 & (uint)fStack_33c);
            fVar231 = (float)((uint)fVar229 & uVar66 | ~uVar66 & (uint)fVar155);
            fVar221 = (float)((uint)fVar272 & uVar68 | ~uVar68 & (uint)fVar72);
            fVar222 = (float)((uint)fVar252 & uVar69 | ~uVar69 & (uint)fVar108);
            fVar223 = (float)((uint)fVar255 & uVar70 | ~uVar70 & (uint)fVar109);
            fVar139 = (float)((uint)fVar110 & uVar66 | ~uVar66 & (uint)fVar271);
            fVar144 = (float)((uint)fVar141 & uVar68 | ~uVar68 & (uint)fVar273);
            fVar172 = (float)((uint)fVar154 & uVar69 | ~uVar69 & (uint)fVar278);
            fVar174 = (float)((uint)fVar173 & uVar70 | ~uVar70 & (uint)fVar280);
            fVar211 = (float)((uint)fVar111 & uVar66 | ~uVar66 & (uint)fVar279);
            fVar219 = (float)((uint)fVar140 & uVar68 | ~uVar68 & (uint)fVar283);
            fVar220 = (float)((uint)fVar142 & uVar69 | ~uVar69 & (uint)fVar299);
            fVar224 = (float)((uint)fVar293 & uVar70 | ~uVar70 & (uint)fVar296);
            fVar229 = (float)((uint)fVar155 & uVar66 | ~uVar66 & (uint)fVar229) - local_3b8;
            fVar272 = (float)((uint)fVar72 & uVar68 | ~uVar68 & (uint)fVar272) - fStack_3b4;
            fVar232 = (float)((uint)fVar108 & uVar69 | ~uVar69 & (uint)fVar252) - fStack_3b0;
            fVar237 = (float)((uint)fVar109 & uVar70 | ~uVar70 & (uint)fVar255) - fStack_3ac;
            fVar238 = (float)((uint)fVar271 & uVar66 | ~uVar66 & (uint)fVar110) -
                      (float)local_43c._4_4_;
            fVar239 = (float)((uint)fVar273 & uVar68 | ~uVar68 & (uint)fVar141) - fStack_434;
            fVar249 = (float)((uint)fVar278 & uVar69 | ~uVar69 & (uint)fVar154) - (float)uStack_430;
            fVar252 = (float)((uint)fVar280 & uVar70 | ~uVar70 & (uint)fVar173) - aStack_42c.m128[0]
            ;
            fVar255 = (float)((uint)fVar279 & uVar66 | ~uVar66 & (uint)fVar111) - fVar181;
            fVar258 = (float)((uint)fVar283 & uVar68 | ~uVar68 & (uint)fVar140) - fVar182;
            fVar269 = (float)((uint)fVar299 & uVar69 | ~uVar69 & (uint)fVar142) - fVar209;
            fVar270 = (float)((uint)fVar296 & uVar70 | ~uVar70 & (uint)fVar293) - fVar210;
            fVar282 = local_3b8 - fVar231;
            fVar279 = fStack_3b4 - fVar221;
            fVar281 = fStack_3b0 - fVar222;
            fVar283 = fStack_3ac - fVar223;
            fVar155 = (float)local_43c._4_4_ - fVar139;
            fVar72 = fStack_434 - fVar144;
            fVar108 = (float)uStack_430 - fVar172;
            fVar109 = aStack_42c.m128[0] - fVar174;
            fVar110 = fVar181 - fVar211;
            fVar141 = fVar182 - fVar219;
            fVar154 = fVar209 - fVar220;
            fVar173 = fVar210 - fVar224;
            fVar271 = ((float)local_43c._4_4_ * fVar255 - fVar181 * fVar238) * 0.0 +
                      (fVar181 * fVar229 - local_3b8 * fVar255) * 0.0 +
                      (local_3b8 * fVar238 - (float)local_43c._4_4_ * fVar229);
            fVar273 = (fStack_434 * fVar258 - fVar182 * fVar239) * 0.0 +
                      (fVar182 * fVar272 - fStack_3b4 * fVar258) * 0.0 +
                      (fStack_3b4 * fVar239 - fStack_434 * fVar272);
            auVar167._4_4_ = fVar273;
            auVar167._0_4_ = fVar271;
            fVar278 = ((float)uStack_430 * fVar269 - fVar209 * fVar249) * 0.0 +
                      (fVar209 * fVar232 - fStack_3b0 * fVar269) * 0.0 +
                      (fStack_3b0 * fVar249 - (float)uStack_430 * fVar232);
            fVar280 = (aStack_42c.m128[0] * fVar270 - fVar210 * fVar252) * 0.0 +
                      (fVar210 * fVar237 - fStack_3ac * fVar270) * 0.0 +
                      (fStack_3ac * fVar252 - aStack_42c.m128[0] * fVar237);
            auVar287._0_4_ =
                 (fVar139 * fVar110 - fVar211 * fVar155) * 0.0 +
                 (fVar211 * fVar282 - fVar231 * fVar110) * 0.0 +
                 (fVar231 * fVar155 - fVar139 * fVar282);
            auVar287._4_4_ =
                 (fVar144 * fVar141 - fVar219 * fVar72) * 0.0 +
                 (fVar219 * fVar279 - fVar221 * fVar141) * 0.0 +
                 (fVar221 * fVar72 - fVar144 * fVar279);
            auVar287._8_4_ =
                 (fVar172 * fVar154 - fVar220 * fVar108) * 0.0 +
                 (fVar220 * fVar281 - fVar222 * fVar154) * 0.0 +
                 (fVar222 * fVar108 - fVar172 * fVar281);
            auVar287._12_4_ =
                 (fVar174 * fVar173 - fVar224 * fVar109) * 0.0 +
                 (fVar224 * fVar283 - fVar223 * fVar173) * 0.0 +
                 (fVar223 * fVar109 - fVar174 * fVar283);
            auVar167._8_4_ = fVar278;
            auVar167._12_4_ = fVar280;
            auVar74 = maxps(auVar167,auVar287);
            bVar51 = auVar74._0_4_ <= 0.0 && bVar51;
            auVar168._0_4_ = -(uint)bVar51;
            bVar25 = auVar74._4_4_ <= 0.0 && bVar25;
            auVar168._4_4_ = -(uint)bVar25;
            bVar26 = auVar74._8_4_ <= 0.0 && bVar26;
            auVar168._8_4_ = -(uint)bVar26;
            bVar27 = auVar74._12_4_ <= 0.0 && bVar27;
            auVar168._12_4_ = -(uint)bVar27;
            iVar52 = movmskps((int)(bezier_basis1 + lVar24),auVar168);
            if (iVar52 == 0) {
LAB_00b251b2:
              auVar150._8_8_ = uStack_2a0;
              auVar150._0_8_ = local_2a8;
            }
            else {
              fVar139 = (ray->super_RayK<1>).tfar;
              fVar172 = fVar155 * fVar255 - fVar110 * fVar238;
              fVar174 = fVar72 * fVar258 - fVar141 * fVar239;
              fVar211 = fVar108 * fVar269 - fVar154 * fVar249;
              fVar219 = fVar109 * fVar270 - fVar173 * fVar252;
              fVar110 = fVar110 * fVar229 - fVar255 * fVar282;
              fVar141 = fVar141 * fVar272 - fVar258 * fVar279;
              fVar144 = fVar154 * fVar232 - fVar269 * fVar281;
              fVar154 = fVar173 * fVar237 - fVar270 * fVar283;
              fVar173 = fVar282 * fVar238 - fVar155 * fVar229;
              fVar220 = fVar279 * fVar239 - fVar72 * fVar272;
              fVar224 = fVar281 * fVar249 - fVar108 * fVar232;
              fVar229 = fVar283 * fVar252 - fVar109 * fVar237;
              auVar149._0_4_ = fVar110 * 0.0 + fVar173;
              auVar149._4_4_ = fVar141 * 0.0 + fVar220;
              auVar149._8_4_ = fVar144 * 0.0 + fVar224;
              auVar149._12_4_ = fVar154 * 0.0 + fVar229;
              auVar208._0_4_ = fVar172 * 0.0 + auVar149._0_4_;
              auVar208._4_4_ = fVar174 * 0.0 + auVar149._4_4_;
              auVar208._8_4_ = fVar211 * 0.0 + auVar149._8_4_;
              auVar208._12_4_ = fVar219 * 0.0 + auVar149._12_4_;
              auVar74 = rcpps(auVar149,auVar208);
              fVar155 = auVar74._0_4_;
              fVar72 = auVar74._4_4_;
              fVar108 = auVar74._8_4_;
              fVar109 = auVar74._12_4_;
              fVar155 = (1.0 - auVar208._0_4_ * fVar155) * fVar155 + fVar155;
              fVar72 = (1.0 - auVar208._4_4_ * fVar72) * fVar72 + fVar72;
              fVar108 = (1.0 - auVar208._8_4_ * fVar108) * fVar108 + fVar108;
              fVar109 = (1.0 - auVar208._12_4_ * fVar109) * fVar109 + fVar109;
              fVar110 = (fVar181 * fVar173 + (float)local_43c._4_4_ * fVar110 + local_3b8 * fVar172)
                        * fVar155;
              fVar141 = (fVar182 * fVar220 + fStack_434 * fVar141 + fStack_3b4 * fVar174) * fVar72;
              fVar144 = (fVar209 * fVar224 + (float)uStack_430 * fVar144 + fStack_3b0 * fVar211) *
                        fVar108;
              fVar154 = (fVar210 * fVar229 + aStack_42c.m128[0] * fVar154 + fStack_3ac * fVar219) *
                        fVar109;
              bVar51 = (local_1c8 <= fVar110 && fVar110 <= fVar139) && bVar51;
              auVar178._0_4_ = -(uint)bVar51;
              bVar25 = (fStack_1c4 <= fVar141 && fVar141 <= fVar139) && bVar25;
              auVar178._4_4_ = -(uint)bVar25;
              bVar26 = (fStack_1c0 <= fVar144 && fVar144 <= fVar139) && bVar26;
              auVar178._8_4_ = -(uint)bVar26;
              bVar27 = (fStack_1bc <= fVar154 && fVar154 <= fVar139) && bVar27;
              auVar178._12_4_ = -(uint)bVar27;
              iVar52 = movmskps(iVar52,auVar178);
              if (iVar52 == 0) goto LAB_00b251b2;
              auVar179._0_8_ =
                   CONCAT44(-(uint)(auVar208._4_4_ != 0.0 && bVar25),
                            -(uint)(auVar208._0_4_ != 0.0 && bVar51));
              auVar179._8_4_ = -(uint)(auVar208._8_4_ != 0.0 && bVar26);
              auVar179._12_4_ = -(uint)(auVar208._12_4_ != 0.0 && bVar27);
              iVar52 = movmskps(iVar52,auVar179);
              auVar150._8_8_ = uStack_2a0;
              auVar150._0_8_ = local_2a8;
              if (iVar52 != 0) {
                fVar271 = fVar271 * fVar155;
                fVar273 = fVar273 * fVar72;
                fVar278 = fVar278 * fVar108;
                fVar280 = fVar280 * fVar109;
                local_2b8 = (float)((uint)(1.0 - fVar271) & uVar66 | ~uVar66 & (uint)fVar271);
                fStack_2b4 = (float)((uint)(1.0 - fVar273) & uVar68 | ~uVar68 & (uint)fVar273);
                fStack_2b0 = (float)((uint)(1.0 - fVar278) & uVar69 | ~uVar69 & (uint)fVar278);
                fStack_2ac = (float)((uint)(1.0 - fVar280) & uVar70 | ~uVar70 & (uint)fVar280);
                local_1b8 = (float)(~uVar66 & (uint)(auVar287._0_4_ * fVar155) |
                                   (uint)(1.0 - auVar287._0_4_ * fVar155) & uVar66);
                fStack_1b4 = (float)(~uVar68 & (uint)(auVar287._4_4_ * fVar72) |
                                    (uint)(1.0 - auVar287._4_4_ * fVar72) & uVar68);
                fStack_1b0 = (float)(~uVar69 & (uint)(auVar287._8_4_ * fVar108) |
                                    (uint)(1.0 - auVar287._8_4_ * fVar108) & uVar69);
                fStack_1ac = (float)(~uVar70 & (uint)(auVar287._12_4_ * fVar109) |
                                    (uint)(1.0 - auVar287._12_4_ * fVar109) & uVar70);
                auVar150._8_4_ = auVar179._8_4_;
                auVar150._0_8_ = auVar179._0_8_;
                auVar150._12_4_ = auVar179._12_4_;
                fVar156 = fVar110;
                fVar203 = fVar141;
                fVar204 = fVar144;
                fVar205 = fVar154;
              }
            }
            iVar52 = movmskps(iVar52,auVar150);
            if (iVar52 != 0) {
              fVar72 = (auVar267._0_4_ - (float)local_268._0_4_) * local_2b8 +
                       (float)local_268._0_4_;
              fVar108 = (auVar267._4_4_ - (float)local_268._4_4_) * fStack_2b4 +
                        (float)local_268._4_4_;
              fVar109 = (auVar267._8_4_ - fStack_260) * fStack_2b0 + fStack_260;
              fVar110 = (auVar267._12_4_ - fStack_25c) * fStack_2ac + fStack_25c;
              fVar155 = local_2f0->depth_scale;
              auVar103._0_4_ = -(uint)(fVar155 * (fVar72 + fVar72) < fVar156) & auVar150._0_4_;
              auVar103._4_4_ = -(uint)(fVar155 * (fVar108 + fVar108) < fVar203) & auVar150._4_4_;
              auVar103._8_4_ = -(uint)(fVar155 * (fVar109 + fVar109) < fVar204) & auVar150._8_4_;
              auVar103._12_4_ = -(uint)(fVar155 * (fVar110 + fVar110) < fVar205) & auVar150._12_4_;
              iVar52 = movmskps((int)local_2f0,auVar103);
              if (iVar52 != 0) {
                local_1b8 = local_1b8 + local_1b8 + -1.0;
                fStack_1b4 = fStack_1b4 + fStack_1b4 + -1.0;
                fStack_1b0 = fStack_1b0 + fStack_1b0 + -1.0;
                fStack_1ac = fStack_1ac + fStack_1ac + -1.0;
                local_158 = local_2b8;
                fStack_154 = fStack_2b4;
                fStack_150 = fStack_2b0;
                fStack_14c = fStack_2ac;
                local_148 = local_1b8;
                fStack_144 = fStack_1b4;
                fStack_140 = fStack_1b0;
                fStack_13c = fStack_1ac;
                local_138 = fVar156;
                fStack_134 = fVar203;
                fStack_130 = fVar204;
                fStack_12c = fVar205;
                local_128 = uVar67;
                local_124 = iVar19;
                local_118 = CONCAT44(fStack_314,local_318);
                uStack_110 = CONCAT44(fStack_30c,fStack_310);
                local_108 = CONCAT44(fStack_284,local_288);
                uStack_100 = CONCAT44(fStack_27c,fStack_280);
                local_f8 = CONCAT44(fStack_294,local_298);
                uStack_f0 = CONCAT44(fStack_28c,fStack_290);
                local_e8 = CONCAT44(fStack_274,local_278);
                uStack_e0 = CONCAT44(fStack_26c,fStack_270);
                local_d8 = auVar103;
                uVar62 = (context->scene->geometries).items[(long)local_3d0].ptr;
                uVar66 = (ray->super_RayK<1>).mask;
                pRVar60 = local_3d0;
                if ((((Geometry *)uVar62)->mask & uVar66) != 0) {
                  local_308 = auVar103;
                  fVar155 = (float)(int)uVar67;
                  local_c8[0] = (fVar155 + local_2b8 + 0.0) * local_78;
                  local_c8[1] = (fVar155 + fStack_2b4 + 1.0) * fStack_74;
                  local_c8[2] = (fVar155 + fStack_2b0 + 2.0) * fStack_70;
                  local_c8[3] = (fVar155 + fStack_2ac + 3.0) * fStack_6c;
                  local_b8 = CONCAT44(fStack_1b4,local_1b8);
                  uStack_b0 = CONCAT44(fStack_1ac,fStack_1b0);
                  local_a8[0] = fVar156;
                  local_a8[1] = fVar203;
                  local_a8[2] = fVar204;
                  local_a8[3] = fVar205;
                  auVar130._0_4_ = auVar103._0_4_ & (uint)fVar156;
                  auVar130._4_4_ = auVar103._4_4_ & (uint)fVar203;
                  auVar130._8_4_ = auVar103._8_4_ & (uint)fVar204;
                  auVar130._12_4_ = auVar103._12_4_ & (uint)fVar205;
                  auVar151._0_8_ = CONCAT44(~auVar103._4_4_,~auVar103._0_4_) & 0x7f8000007f800000;
                  auVar151._8_4_ = ~auVar103._8_4_ & 0x7f800000;
                  auVar151._12_4_ = ~auVar103._12_4_ & 0x7f800000;
                  auVar151 = auVar151 | auVar130;
                  auVar169._4_4_ = auVar151._0_4_;
                  auVar169._0_4_ = auVar151._4_4_;
                  auVar169._8_4_ = auVar151._12_4_;
                  auVar169._12_4_ = auVar151._8_4_;
                  auVar74 = minps(auVar169,auVar151);
                  auVar131._0_8_ = auVar74._8_8_;
                  auVar131._8_4_ = auVar74._0_4_;
                  auVar131._12_4_ = auVar74._4_4_;
                  auVar74 = minps(auVar131,auVar74);
                  auVar132._0_8_ =
                       CONCAT44(-(uint)(auVar74._4_4_ == auVar151._4_4_) & auVar103._4_4_,
                                -(uint)(auVar74._0_4_ == auVar151._0_4_) & auVar103._0_4_);
                  auVar132._8_4_ = -(uint)(auVar74._8_4_ == auVar151._8_4_) & auVar103._8_4_;
                  auVar132._12_4_ = -(uint)(auVar74._12_4_ == auVar151._12_4_) & auVar103._12_4_;
                  iVar52 = movmskps(uVar66,auVar132);
                  if (iVar52 != 0) {
                    auVar103._8_4_ = auVar132._8_4_;
                    auVar103._0_8_ = auVar132._0_8_;
                    auVar103._12_4_ = auVar132._12_4_;
                  }
                  uVar66 = movmskps(iVar52,auVar103);
                  lVar63 = 0;
                  if (uVar66 != 0) {
                    for (; (uVar66 >> lVar63 & 1) == 0; lVar63 = lVar63 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (((Geometry *)uVar62)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar155 = local_c8[lVar63];
                    fVar72 = *(float *)((long)&local_b8 + lVar63 * 4);
                    fVar108 = 1.0 - fVar155;
                    fVar110 = fVar155 * fVar108 + fVar155 * fVar108;
                    fVar109 = fVar108 * fVar108 * -3.0;
                    fVar139 = (fVar108 * fVar108 - fVar110) * 3.0;
                    fVar108 = (fVar110 - fVar155 * fVar155) * 3.0;
                    fVar110 = fVar155 * fVar155 * 3.0;
                    (ray->super_RayK<1>).tfar = local_a8[lVar63];
                    *(ulong *)&(ray->Ng).field_0 =
                         CONCAT44(fVar109 * fStack_314 +
                                  fVar139 * fStack_284 + fVar108 * fStack_294 + fVar110 * fStack_274
                                  ,fVar109 * local_318 +
                                   fVar139 * local_288 + fVar108 * local_298 + fVar110 * local_278);
                    (ray->Ng).field_0.field_0.z =
                         fVar109 * fStack_310 +
                         fVar139 * fStack_280 + fVar108 * fStack_290 + fVar110 * fStack_270;
                    ray->u = fVar155;
                    ray->v = fVar72;
                    ray->primID = (uint)local_3a0;
                    ray->geomID = (uint)local_3d0;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                    pRVar60 = (RTCIntersectArguments *)context;
                    prim = local_2f8;
                  }
                  else {
                    _local_468 = ZEXT416((uint)(ray->super_RayK<1>).tfar);
                    local_378 = fVar156;
                    fStack_374 = fVar203;
                    fStack_370 = fVar204;
                    fStack_36c = fVar205;
                    stack0xfffffffffffffbc8 = uVar62;
LAB_00b25200:
                    local_1fc = local_c8[lVar63];
                    local_1f8 = *(undefined4 *)((long)&local_b8 + lVar63 * 4);
                    (ray->super_RayK<1>).tfar = local_a8[lVar63];
                    local_2e8.context = context->user;
                    fVar155 = 1.0 - local_1fc;
                    fVar108 = local_1fc * fVar155 + local_1fc * fVar155;
                    fVar72 = fVar155 * fVar155 * -3.0;
                    fVar109 = (fVar155 * fVar155 - fVar108) * 3.0;
                    fVar155 = (fVar108 - local_1fc * local_1fc) * 3.0;
                    fVar108 = local_1fc * local_1fc * 3.0;
                    local_208 = CONCAT44(fVar72 * fStack_314 +
                                         fVar109 * fStack_284 +
                                         fVar155 * fStack_294 + fVar108 * fStack_274,
                                         fVar72 * local_318 +
                                         fVar109 * local_288 +
                                         fVar155 * local_298 + fVar108 * local_278);
                    local_200 = fVar72 * fStack_310 +
                                fVar109 * fStack_280 + fVar155 * fStack_290 + fVar108 * fStack_270;
                    local_1f4 = (int)local_3a0;
                    local_1f0 = (int)local_3d0;
                    local_1ec = (local_2e8.context)->instID[0];
                    local_1e8 = (local_2e8.context)->instPrimID[0];
                    local_43c._0_4_ = -NAN;
                    local_2e8.valid = (int *)local_43c;
                    pRVar60 = (RTCIntersectArguments *)((Geometry *)uVar62)->userPtr;
                    local_2e8.geometryUserPtr = pRVar60;
                    local_2e8.ray = (RTCRayN *)ray;
                    local_2e8.hit = (RTCHitN *)&local_208;
                    local_2e8.N = 1;
                    if ((((Geometry *)uVar62)->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*((Geometry *)uVar62)->intersectionFilterN)(&local_2e8),
                       uVar61 = extraout_RDX, uVar62 = stack0xfffffffffffffbc8, fVar156 = local_378,
                       fVar203 = fStack_374, fVar204 = fStack_370, fVar205 = fStack_36c,
                       (((RayK<1> *)local_2e8.valid)->org).field_0.m128[0] != 0.0)) {
                      pRVar60 = context->args;
                      if (((RTCIntersectArguments *)pRVar60->filter != (RTCIntersectArguments *)0x0)
                         && (((((ulong)*(Scene **)&pRVar60->flags & 2) != 0 ||
                              (((((Geometry *)uVar62)->field_8).field_0x2 & 0x40) != 0)) &&
                             ((*(code *)pRVar60->filter)(&local_2e8), uVar61 = extraout_RDX_00,
                             uVar62 = stack0xfffffffffffffbc8, fVar156 = local_378,
                             fVar203 = fStack_374, fVar204 = fStack_370, fVar205 = fStack_36c,
                             (((RayK<1> *)local_2e8.valid)->org).field_0.m128[0] == 0.0))))
                      goto LAB_00b25422;
                      (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2e8.hit;
                      (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2e8.hit + 4);
                      (((Vec3f *)((long)local_2e8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2e8.hit + 8);
                      *(float *)((long)local_2e8.ray + 0x3c) = *(float *)(local_2e8.hit + 0xc);
                      *(float *)((long)local_2e8.ray + 0x40) = *(float *)(local_2e8.hit + 0x10);
                      *(float *)((long)local_2e8.ray + 0x44) = *(float *)(local_2e8.hit + 0x14);
                      *(float *)((long)local_2e8.ray + 0x48) = *(float *)(local_2e8.hit + 0x18);
                      uVar61 = (ulong)(uint)*(float *)(local_2e8.hit + 0x1c);
                      *(float *)((long)local_2e8.ray + 0x4c) = *(float *)(local_2e8.hit + 0x1c);
                      pRVar60 = (RTCIntersectArguments *)
                                (ulong)(uint)*(float *)(local_2e8.hit + 0x20);
                      *(float *)((long)local_2e8.ray + 0x50) = *(float *)(local_2e8.hit + 0x20);
                      pRVar56 = (RayHit *)local_2e8.ray;
                    }
                    else {
LAB_00b25422:
                      (ray->super_RayK<1>).tfar = (float)local_468._0_4_;
                      pRVar56 = (RayHit *)local_2e8.valid;
                      uVar62 = stack0xfffffffffffffbc8;
                      fVar156 = local_378;
                      fVar203 = fStack_374;
                      fVar204 = fStack_370;
                      fVar205 = fStack_36c;
                    }
                    *(undefined4 *)(local_308 + lVar63 * 4) = 0;
                    fVar155 = (ray->super_RayK<1>).tfar;
                    local_468._0_4_ = (ray->super_RayK<1>).tfar;
                    local_468._4_4_ = (ray->super_RayK<1>).mask;
                    fStack_460 = (float)(ray->super_RayK<1>).id;
                    fStack_45c = (float)(ray->super_RayK<1>).flags;
                    auVar104._0_4_ = -(uint)(fVar156 <= fVar155) & local_308._0_4_;
                    auVar104._4_4_ = -(uint)(fVar203 <= fVar155) & local_308._4_4_;
                    auVar104._8_4_ = -(uint)(fVar204 <= fVar155) & local_308._8_4_;
                    auVar104._12_4_ = -(uint)(fVar205 <= fVar155) & local_308._12_4_;
                    local_308 = auVar104;
                    iVar52 = movmskps((int)pRVar56,auVar104);
                    prim = local_2f8;
                    if (iVar52 != 0) {
                      auVar133._0_4_ = auVar104._0_4_ & (uint)fVar156;
                      auVar133._4_4_ = auVar104._4_4_ & (uint)fVar203;
                      auVar133._8_4_ = auVar104._8_4_ & (uint)fVar204;
                      auVar133._12_4_ = auVar104._12_4_ & (uint)fVar205;
                      auVar152._0_8_ =
                           CONCAT44(~auVar104._4_4_,~auVar104._0_4_) & 0x7f8000007f800000;
                      auVar152._8_4_ = ~auVar104._8_4_ & 0x7f800000;
                      auVar152._12_4_ = ~auVar104._12_4_ & 0x7f800000;
                      auVar152 = auVar152 | auVar133;
                      auVar170._4_4_ = auVar152._0_4_;
                      auVar170._0_4_ = auVar152._4_4_;
                      auVar170._8_4_ = auVar152._12_4_;
                      auVar170._12_4_ = auVar152._8_4_;
                      auVar74 = minps(auVar170,auVar152);
                      auVar134._0_8_ = auVar74._8_8_;
                      auVar134._8_4_ = auVar74._0_4_;
                      auVar134._12_4_ = auVar74._4_4_;
                      auVar74 = minps(auVar134,auVar74);
                      auVar135._0_8_ =
                           CONCAT44(-(uint)(auVar74._4_4_ == auVar152._4_4_) & auVar104._4_4_,
                                    -(uint)(auVar74._0_4_ == auVar152._0_4_) & auVar104._0_4_);
                      auVar135._8_4_ = -(uint)(auVar74._8_4_ == auVar152._8_4_) & auVar104._8_4_;
                      auVar135._12_4_ = -(uint)(auVar74._12_4_ == auVar152._12_4_) & auVar104._12_4_
                      ;
                      iVar52 = movmskps(iVar52,auVar135);
                      if (iVar52 != 0) {
                        auVar104._8_4_ = auVar135._8_4_;
                        auVar104._0_8_ = auVar135._0_8_;
                        auVar104._12_4_ = auVar135._12_4_;
                      }
                      uVar288 = movmskps(iVar52,auVar104);
                      uVar57 = CONCAT44((int)((ulong)pRVar56 >> 0x20),uVar288);
                      lVar63 = 0;
                      if (uVar57 != 0) {
                        for (; (uVar57 >> lVar63 & 1) == 0; lVar63 = lVar63 + 1) {
                        }
                      }
                      goto LAB_00b25200;
                    }
                  }
                }
              }
            }
          }
          iVar58 = (int)pRVar60;
          local_378 = fVar156;
          fStack_374 = fVar203;
          fStack_370 = fVar204;
          fStack_36c = fVar205;
          lVar64 = lVar64 + 4;
          fVar156 = local_3c8;
          fVar224 = fStack_3c4;
          fVar229 = fStack_3c0;
          fVar231 = fStack_3bc;
          uVar288 = aStack_40c.field_0.y;
          uVar230 = aStack_40c.field_0.z;
          fVar272 = fStack_400;
          fVar221 = fStack_3fc;
        } while ((int)lVar64 < iVar19);
      }
      fVar155 = (ray->super_RayK<1>).tfar;
      auVar129._4_4_ = -(uint)(fStack_44 <= fVar155);
      auVar129._0_4_ = -(uint)(local_48 <= fVar155);
      auVar129._8_4_ = -(uint)(fStack_40 <= fVar155);
      auVar129._12_4_ = -(uint)(fStack_3c <= fVar155);
      uVar66 = movmskps(iVar58,auVar129);
      uVar65 = uVar65 & uVar65 + 0xf & uVar66;
    } while (uVar65 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }